

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O2

void __thiscall hedg::MarketGenerator::generate(MarketGenerator *this)

{
  uint8_t uVar1;
  char cVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  parser *ppVar5;
  dom_parser_implementation *pdVar6;
  long lVar7;
  _Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false> _Var8;
  MarketGenerator *pMVar9;
  size_t sVar10;
  char *pcVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  error_code eVar13;
  int iVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  pointer __p;
  pointer __p_00;
  long *plVar17;
  uint *puVar18;
  uint *puVar19;
  undefined8 *puVar20;
  json_iterator *pjVar21;
  bool bVar22;
  time_unit t;
  json_iterator *in_RCX;
  string *end_time_;
  uint uVar23;
  void *__buf;
  long lVar24;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined4 uVar25;
  pthread_mutex_t *this_00;
  ulong uVar26;
  _Alloc_hider _Var27;
  int iVar28;
  uint *puVar29;
  string *end_point_;
  uint uVar30;
  byte *pbVar31;
  byte *pbVar32;
  byte *pbVar33;
  byte bVar34;
  bool bVar35;
  undefined1 local_8a8 [16];
  uint *local_898;
  string local_890;
  undefined4 local_86c;
  context context;
  uint *local_850;
  basic_string_view<char,_std::char_traits<char>_> local_848;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838 [7];
  basic_string_view<char,_std::char_traits<char>_> local_7c8;
  uint *local_7b8;
  error_code local_7b0;
  undefined1 local_7a8 [16];
  uint *local_798;
  undefined4 local_790;
  string country_code;
  Market_Projection local_768;
  pthread_mutex_t *local_700;
  MarketGenerator *local_6f8;
  undefined1 local_6f0 [8];
  undefined1 local_6e8 [16];
  size_t local_6d8;
  size_t local_6d0;
  undefined1 local_6c8 [16];
  padded_string p_d;
  io_service service;
  undefined1 local_688 [16];
  undefined1 local_678 [16];
  undefined1 local_668 [16];
  undefined1 local_658;
  error_code local_650;
  market_catalogue local_648;
  basic_string_view<char,_std::char_traits<char>_> local_528;
  string event_type;
  string m_tm;
  string local_4d8;
  string local_4b8;
  string m_id;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string end_time;
  string start_time;
  string local_338;
  system_error e;
  
  this_00 = (pthread_mutex_t *)&this->mut_;
  local_700 = this_00;
  local_6f8 = this;
  do {
    t = (time_unit)in_RCX;
    std::mutex::lock((mutex *)&this_00->__data);
    Betfair_Auth::get_session_id_abi_cxx11_();
    pMVar9 = local_6f8;
    std::__cxx11::string::operator=((string *)local_6f8,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    Timing::now_abi_cxx11_();
    Timing::after_abi_cxx11_
              (&end_time,(Timing *)(long)pMVar9->time_span_,(ulong)pMVar9->time_unit_,t);
    boost::asio::io_context::io_context(&service);
    boost::asio::ssl::context::context(&context,tlsv12_client);
    Client<hedg::Rest_Client>::Client
              ((Client<hedg::Rest_Client> *)&e,(string *)config::betting_host_abi_cxx11_,
               (string *)config::betting_port_abi_cxx11_,&service,&context);
    std::__cxx11::string::string((string *)&local_398,(string *)pMVar9);
    std::__cxx11::string::string((string *)&local_3b8,(string *)&start_time);
    std::__cxx11::string::string((string *)&local_3d8,(string *)&end_time);
    std::__cxx11::string::string
              ((string *)&local_3f8,(string *)config::market_catalogue_endpoint_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_418,(string *)config::event_type_ids_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)&local_438,(string *)config::market_type_codes_abi_cxx11_);
    std::__cxx11::string::string((string *)&local_458,(string *)config::market_countries_abi_cxx11_)
    ;
    std::__cxx11::string::string((string *)&local_478,(string *)config::max_results_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)&local_890,(string *)config::market_projection_abi_cxx11_);
    end_time_ = &local_3d8;
    end_point_ = &local_3f8;
    params::market_catalogue::market_catalogue
              (&local_648,&local_398,&local_3b8,end_time_,end_point_,&local_418,&local_438,
               &local_458,&local_478,&local_890);
    iVar28 = (int)end_point_;
    Client<hedg::Rest_Client>::
    send_request<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::market_catalogue>
              ((Client<hedg::Rest_Client> *)&e,rest::message<hedg::params::market_catalogue>,
               &local_648);
    params::market_catalogue::~market_catalogue(&local_648);
    std::__cxx11::string::~string((string *)&local_890);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_398);
    Rest_Client::recv_abi_cxx11_
              ((Rest_Client *)&local_848,(int)(Client<hedg::Rest_Client> *)&e,__buf,
               (size_t)end_time_,iVar28);
    simdjson::padded_string::padded_string(&p_d,(string *)&local_848);
    std::__cxx11::string::~string((string *)&local_848);
    pcVar11 = p_d.data_ptr;
    sVar10 = p_d.viable_size;
    local_6f0[0] = true;
    local_6e8 = (undefined1  [16])0x0;
    local_6d8 = 0xffffffff;
    local_6d0 = 0x400;
    local_6c8 = (undefined1  [16])0x0;
    eVar13 = CAPACITY;
    if (p_d.viable_size >> 0x20 == 0) {
      local_6e8 = ZEXT816(0);
      __p = (pointer)operator_new__((p_d.viable_size * 5) / 3 + 0x5f & 0x7ffffffc0,
                                    (nothrow_t *)&std::nothrow);
      std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
                ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)local_6c8,
                 __p);
      __p_00 = (pointer)operator_new__(0x2000,(nothrow_t *)&std::nothrow);
      std::__uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>::
      reset((__uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_> *)
            (local_6c8 + 8),__p_00);
      if ((__uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
           )local_6e8._0_8_ ==
          (__uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
           )0x0) {
        eVar13 = (**(code **)(*simdjson::active_implementation + 0x18))
                           (simdjson::active_implementation,sVar10,0x400,local_6e8);
      }
      else {
        eVar13 = (**(code **)(*(long *)local_6e8._0_8_ + 0x20))(local_6e8._0_8_,sVar10);
        if (eVar13 != SUCCESS) goto LAB_001515f7;
        eVar13 = (**(code **)(*(long *)local_6e8._0_8_ + 0x28))(local_6e8._0_8_,0x400);
      }
      if (eVar13 != SUCCESS) goto LAB_001515f7;
      local_6e8._8_8_ = sVar10;
      local_6d0 = 0x400;
      eVar13 = (**(code **)(*(long *)local_6e8._0_8_ + 8))(local_6e8._0_8_,pcVar11,sVar10,0);
      if (eVar13 != SUCCESS) goto LAB_001515f7;
      local_838[0]._0_8_ = *(undefined8 *)(local_6e8._0_8_ + 0x10);
      local_688._8_8_ = local_838[0]._0_8_;
      local_688._0_8_ = pcVar11;
      local_678._8_8_ = local_6c8._0_8_;
      local_678._0_8_ = local_6f0;
      local_668._8_8_ = local_838[0]._0_8_;
      local_668._0_8_ = 0x100000000;
      local_658 = 0;
      local_650 = SUCCESS;
      local_848._M_str._0_4_ = 1;
      local_848._M_len = (size_t)local_688;
      simdjson::fallback::ondemand::value_iterator::assert_at_start((value_iterator *)&local_848);
      eVar13 = INCORRECT_TYPE;
      if (*(char *)(*(long *)local_848._M_len + (ulong)**(uint **)(local_848._M_len + 8)) == '[') {
        *(uint **)(local_848._M_len + 8) = *(uint **)(local_848._M_len + 8) + 1;
        if ((*(byte *)(local_848._M_len + 0x30) & 1) == 0) {
          iVar28 = *(int *)(*(long *)(*(long *)(local_848._M_len + 0x10) + 8) + 8);
          if (iVar28 == 0) {
            __assert_fail("n_structural_indexes > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                          ,0x63ce,
                          "token_position simdjson::fallback::ondemand::json_iterator::last_position() const"
                         );
          }
          if (*(char *)(*(long *)local_848._M_len +
                       (ulong)*(uint *)(*(long *)(*(long *)(*(long *)(local_848._M_len + 0x10) + 8)
                                                 + 0x10) + (ulong)(iVar28 - 1) * 4)) != ']') {
            *(long *)(local_848._M_len + 0x10) = 0;
            *(long *)(local_848._M_len + 0x20) = 0x1b;
            eVar13 = INCOMPLETE_ARRAY_OR_OBJECT;
            goto LAB_00154e14;
          }
        }
        simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                  ((value_iterator *)&local_848);
        if (*(char *)(*(long *)local_848._M_len + (ulong)**(uint **)(local_848._M_len + 8)) == ']')
        {
          *(uint **)(local_848._M_len + 8) = *(uint **)(local_848._M_len + 8) + 1;
          if (0x7ffffffd < (uint)local_848._M_str - 1) {
LAB_00155894:
            __assert_fail("parent_depth >= 0 && parent_depth < (2147483647) - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                          ,0x63d6,
                          "void simdjson::fallback::ondemand::json_iterator::ascend_to(depth_t)");
          }
          if (*(uint *)(local_848._M_len + 0x24) != (uint)local_848._M_str) {
LAB_001558b3:
            __assert_fail("_depth == parent_depth + 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                          ,0x63d7,
                          "void simdjson::fallback::ondemand::json_iterator::ascend_to(depth_t)");
          }
          *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
        }
        else {
          if (0x7ffffffd < (ulong)(uint)local_848._M_str) {
LAB_0015581f:
            __assert_fail("child_depth >= 1 && child_depth < (2147483647)",
                          "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                          ,0x63dc,
                          "void simdjson::fallback::ondemand::json_iterator::descend_to(depth_t)");
          }
          if (*(uint *)(local_848._M_len + 0x24) != (uint)local_848._M_str) {
LAB_00155800:
            __assert_fail("_depth == child_depth - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                          ,0x63dd,
                          "void simdjson::fallback::ondemand::json_iterator::descend_to(depth_t)");
          }
          *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str + 1;
          *(undefined8 *)
           (*(long *)(*(long *)(local_848._M_len + 0x10) + 0x30) + (ulong)(uint)local_848._M_str * 8
           ) = local_838[0]._M_allocated_capacity;
        }
        local_7b8 = (uint *)local_838[0]._0_8_;
        if ((*(long *)(local_848._M_len + 8) - local_838[0]._0_8_ == 4) ||
           (*(long *)(local_848._M_len + 8) - local_838[0]._0_8_ == 8)) {
          local_7c8 = local_848;
          local_7b0 = SUCCESS;
        }
        else {
          local_7c8._M_len = 0;
          local_7c8._M_str = (char *)0x0;
          local_7b8 = (uint *)0x0;
          local_7b0 = OUT_OF_ORDER_ITERATION;
        }
      }
      else {
LAB_00154e14:
        local_7c8._M_len = 0;
        local_7c8._M_str = (char *)0x0;
        local_7b8 = (uint *)0x0;
        local_7b0 = eVar13;
      }
    }
    else {
LAB_001515f7:
      local_668 = (undefined1  [16])0x0;
      local_678 = (undefined1  [16])0x0;
      local_688 = (undefined1  [16])0x0;
      local_658 = 0;
      local_7c8._M_len = 0;
      local_7c8._M_str = (char *)0x0;
      local_7b8 = (uint *)0x0;
      local_7b0 = eVar13;
      local_650 = eVar13;
    }
LAB_0015163f:
    eVar13 = local_7b0;
    if ((json_iterator *)local_7c8._M_len != (json_iterator *)0x0) {
      if (*(depth_t *)(local_7c8._M_len + 0x24) < (int)(uint)local_7c8._M_str) goto LAB_001549fc;
      if (local_7b0 != SUCCESS) goto LAB_001551e7;
      if (*(error_code *)(local_7c8._M_len + 0x20) != SUCCESS) {
        *(parser **)(local_7c8._M_len + 0x10) = (parser *)0x0;
        *(depth_t *)(local_7c8._M_len + 0x24) = 0;
        eVar13 = *(error_code *)(local_7c8._M_len + 0x20);
        goto LAB_001551e7;
      }
      simdjson::fallback::ondemand::value_iterator::assert_at_child((value_iterator *)&local_7c8);
      local_838[0]._0_8_ = ((token_iterator *)local_7c8._M_len)->_position;
      local_848._M_str._0_4_ = (uint)local_7c8._M_str + 1;
      local_848._M_len = local_7c8._M_len;
      local_838[0]._8_4_ = 0;
      puVar19 = ((token_iterator *)local_7c8._M_len)->_position;
      lVar24 = (long)puVar19 - local_838[0]._0_8_;
      if (puVar19 == (uint *)local_838[0]._0_8_) {
        simdjson::fallback::ondemand::value_iterator::assert_at_start((value_iterator *)&local_848);
        if (*(char *)(*(long *)local_848._M_len + (ulong)**(uint **)(local_848._M_len + 8)) == '{')
        {
          *(uint **)(local_848._M_len + 8) = *(uint **)(local_848._M_len + 8) + 1;
LAB_00151702:
          simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                    ((value_iterator *)&local_848);
          iVar28 = (uint)local_848._M_str;
          ((*(parser **)(local_848._M_len + 0x10))->start_positions)._M_t.
          super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>
          .super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl
          [(int)(uint)local_848._M_str] = (uint *)local_838[0]._0_8_;
          if (*(char *)(*(long *)local_848._M_len +
                       (ulong)**(token_position *)(local_848._M_len + 8)) == '}') {
            *(token_position *)(local_848._M_len + 8) =
                 *(token_position *)(local_848._M_len + 8) + 1;
            if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
            if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
            *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
          }
          local_8a8._0_8_ = local_848._M_len;
          local_8a8._8_8_ = local_848._M_str;
          local_898 = (uint *)local_838[0]._0_8_;
          puVar19 = *(token_position *)(local_848._M_len + 8);
          bVar12 = local_848;
          if (puVar19 <= (ulong)local_838[0]._0_8_) goto LAB_001558dc;
          bVar35 = true;
          puVar18 = puVar19;
          if (puVar19 == (uint *)(local_838[0]._M_allocated_capacity + 4)) {
LAB_00151818:
            bVar22 = true;
LAB_00151959:
            while (bVar22) {
              if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_0015583e;
              simdjson::fallback::ondemand::value_iterator::assert_at_next
                        ((value_iterator *)local_8a8);
              puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
              puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
              ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
              uVar26 = (ulong)*puVar19;
              if (puVar3[uVar26] != '\"') {
                *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
                *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
                local_838[0]._8_4_ = 3;
                goto LAB_00154ce3;
              }
              simdjson::fallback::ondemand::value_iterator::assert_at_next
                        ((value_iterator *)local_8a8);
              puVar4 = ((token_iterator *)local_8a8._0_8_)->buf;
              puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
              ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
              if (puVar4[*puVar19] != ':') {
                *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
                *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
                local_838[0]._8_4_ = 3;
                goto LAB_00154ce3;
              }
              if (0x7ffffffd < (uint)local_8a8._8_4_) goto LAB_0015581f;
              if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_00155800;
              iVar28 = local_8a8._8_4_ + 1;
              *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
              if ((puVar3[uVar26 + 9] == '\"') &&
                 (*(long *)(puVar3 + uVar26 + 1) == 0x644974656b72616d)) goto LAB_00151d34;
              if (puVar19 + 1 <= local_898) goto LAB_00155861;
              ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 2;
              uVar30 = puVar4[puVar19[1]] - 0x2c;
              if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
                 (puVar4[puVar19[1]] == 0x7b)) {
                ppVar5 = *(parser **)(local_8a8._0_8_ + 0x10);
                puVar19 = puVar19 + 2;
LAB_00151a48:
                do {
                  while( true ) {
                    pdVar6 = (ppVar5->implementation)._M_t.
                             super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                             .
                             super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>
                             ._M_head_impl;
                    if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                                (long)(pdVar6->structural_indexes)._M_t.
                                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                ) <= puVar19) {
                      *(error_code *)(local_8a8._0_8_ + 0x20) = TAPE_ERROR;
                      goto LAB_00154cd3;
                    }
                    puVar29 = puVar19 + 1;
                    ((token_iterator *)local_8a8._0_8_)->_position = puVar29;
                    uVar1 = puVar4[*puVar19];
                    puVar19 = puVar29;
                    if (uVar1 != '[') break;
LAB_00151a8c:
                    iVar28 = iVar28 + 1;
                    *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
                  }
                  if ((uVar1 != ']') && (uVar1 != '}')) {
                    if (uVar1 == '{') goto LAB_00151a8c;
                    goto LAB_00151a48;
                  }
                  iVar28 = iVar28 + -1;
                  *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
                } while ((int)local_8a8._8_4_ < iVar28);
              }
              else {
                *(undefined4 *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_;
              }
              simdjson::fallback::ondemand::value_iterator::assert_at_next
                        ((value_iterator *)local_8a8);
              puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
              ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
              uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
              bVar22 = true;
              if (uVar1 != ',') {
                if (uVar1 != '}') {
                  *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
                  *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
LAB_00154cd3:
                  local_838[0]._8_4_ = 3;
                  goto LAB_00154ce3;
                }
                if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
                if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
                *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
                bVar22 = false;
              }
            }
            if (!bVar35) {
              *(undefined4 *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_;
              ((token_iterator *)local_8a8._0_8_)->_position = local_898 + 1;
              simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                        ((value_iterator *)local_8a8);
              ((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
              super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>
              .super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl
              [(int)local_8a8._8_4_] = local_898;
              puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
              bVar35 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19] != '}';
              if (!bVar35) {
                ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
                if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
                if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
                *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
              }
              while( true ) {
                if (!bVar35) goto LAB_0015576e;
                if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_0015574f;
                simdjson::fallback::ondemand::value_iterator::assert_at_next
                          ((value_iterator *)local_8a8);
                puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
                puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
                ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
                uVar26 = (ulong)*puVar19;
                pjVar21 = (json_iterator *)local_8a8._0_8_;
                if (puVar3[uVar26] != '\"') goto LAB_0015566f;
                simdjson::fallback::ondemand::value_iterator::assert_at_next
                          ((value_iterator *)local_8a8);
                puVar4 = ((token_iterator *)local_8a8._0_8_)->buf;
                puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
                ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
                pjVar21 = (json_iterator *)local_8a8._0_8_;
                if (puVar4[*puVar19] != ':') goto LAB_001556c5;
                if (0x7ffffffd < (uint)local_8a8._8_4_) goto LAB_0015581f;
                if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_00155800;
                iVar28 = local_8a8._8_4_ + 1;
                *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
                if ((puVar3[uVar26 + 9] == '\"') &&
                   (*(long *)(puVar3 + uVar26 + 1) == 0x644974656b72616d)) break;
                if (puVar19 + 1 <= local_898) goto LAB_00155861;
                puVar29 = puVar19 + 2;
                ((token_iterator *)local_8a8._0_8_)->_position = puVar29;
                uVar30 = puVar4[puVar19[1]] - 0x2c;
                if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
                   (puVar4[puVar19[1]] == 0x7b)) {
                  ppVar5 = *(parser **)(local_8a8._0_8_ + 0x10);
                  puVar19 = puVar29;
LAB_00151c6f:
                  do {
                    while( true ) {
                      pdVar6 = (ppVar5->implementation)._M_t.
                               super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                               .
                               super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>
                               ._M_head_impl;
                      if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                                  (long)(pdVar6->structural_indexes)._M_t.
                                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                  ) <= puVar19) {
                        *(error_code *)(local_8a8._0_8_ + 0x20) = TAPE_ERROR;
                        local_838[0]._8_4_ = 3;
                        goto LAB_00154ce3;
                      }
                      puVar29 = puVar19 + 1;
                      ((token_iterator *)local_8a8._0_8_)->_position = puVar29;
                      uVar1 = puVar4[*puVar19];
                      puVar19 = puVar29;
                      if (uVar1 != '[') break;
LAB_00151cb3:
                      iVar28 = iVar28 + 1;
                      *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
                    }
                    if ((uVar1 != ']') && (uVar1 != '}')) {
                      if (uVar1 == '{') goto LAB_00151cb3;
                      goto LAB_00151c6f;
                    }
                    iVar28 = iVar28 + -1;
                    *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
                  } while ((int)local_8a8._8_4_ < iVar28);
                }
                else {
                  *(undefined4 *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_;
                }
                if (puVar29 == puVar18) {
                  local_838[0]._8_4_ = 0x13;
                  goto LAB_00154ce3;
                }
                simdjson::fallback::ondemand::value_iterator::assert_at_next
                          ((value_iterator *)local_8a8);
                puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
                ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
                uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
                bVar35 = true;
                if (uVar1 != ',') {
                  pjVar21 = (json_iterator *)local_8a8._0_8_;
                  if (uVar1 != '}') goto LAB_0015569f;
                  if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
                  if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
                  *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
                  bVar35 = false;
                }
              }
LAB_00151d34:
              simdjson::fallback::ondemand::value_iterator::assert_at_child
                        ((value_iterator *)local_8a8);
              puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
              local_848._M_str._0_4_ = local_8a8._8_4_ + 1;
              local_848._M_len = local_8a8._0_8_;
              local_838[0]._8_4_ = 0;
              puVar18 = ((token_iterator *)local_8a8._0_8_)->_position;
              pjVar21 = (json_iterator *)local_8a8._0_8_;
              local_838[0]._0_8_ = puVar19;
              if (puVar18 == puVar19) {
                simdjson::fallback::ondemand::value_iterator::assert_at_start
                          ((value_iterator *)&local_848);
                puVar19 = *(token_position *)(local_848._M_len + 8);
                puVar18 = puVar19;
                pjVar21 = (json_iterator *)local_848._M_len;
              }
              puVar3 = (pjVar21->token).buf;
              uVar30 = *puVar19;
              if (puVar3[uVar30] != '\"') {
                uVar25 = 0x10;
LAB_001550eb:
                puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
                goto LAB_00154cff;
              }
              if (puVar18 == (uint *)local_838[0]._0_8_) {
                simdjson::fallback::ondemand::value_iterator::assert_at_start
                          ((value_iterator *)&local_848);
                *(token_position *)(local_848._M_len + 8) =
                     *(token_position *)(local_848._M_len + 8) + 1;
                if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
                if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str)
                goto LAB_001558b3;
                *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
                pjVar21 = (json_iterator *)local_848._M_len;
              }
              pbVar31 = pjVar21->_string_buf_loc;
              pbVar33 = puVar3 + (ulong)uVar30 + 1;
              do {
                lVar24 = 1;
                bVar34 = *pbVar33;
                *pbVar31 = bVar34;
                if (bVar34 == 0x5c) {
                  if ((ulong)pbVar33[1] == 0x75) {
                    uVar15 = simdjson::fallback::anon_unknown_0::jsoncharutils::hex_to_u32_nocheck
                                       (pbVar33 + 2);
                    pbVar32 = pbVar33 + 6;
                    if ((uVar15 & 0xfffffc00) == 0xd800) {
                      if (((*pbVar32 == 0x5c) && (pbVar33[7] == 0x75)) &&
                         (uVar16 = simdjson::fallback::anon_unknown_0::jsoncharutils::
                                   hex_to_u32_nocheck(pbVar33 + 8), uVar16 < 0x10000)) {
                        uVar15 = (uVar16 - 0xdc00 | uVar15 * 0x400 + 0xfca00000) + 0x10000;
                        pbVar32 = pbVar33 + 0xc;
                        goto LAB_00151e67;
                      }
LAB_00154f25:
                      uVar25 = 5;
                      goto LAB_001550eb;
                    }
LAB_00151e67:
                    lVar24 = 1;
                    bVar34 = (byte)uVar15;
                    if (uVar15 < 0x80) {
                      *pbVar31 = bVar34;
                    }
                    else if (uVar15 < 0x800) {
                      *pbVar31 = (byte)(uVar15 >> 6) | 0xc0;
                      pbVar31[1] = bVar34 & 0x3f | 0x80;
                      lVar24 = 2;
                    }
                    else if (uVar15 < 0x10000) {
                      *pbVar31 = (byte)(uVar15 >> 0xc) | 0xe0;
                      pbVar31[1] = (byte)(uVar15 >> 6) & 0x3f | 0x80;
                      pbVar31[2] = bVar34 & 0x3f | 0x80;
                      lVar24 = 3;
                    }
                    else {
                      if (0x10ffff < uVar15) goto LAB_00154f25;
                      *pbVar31 = (byte)(uVar15 >> 0x12) | 0xf0;
                      pbVar31[1] = (byte)(uVar15 >> 0xc) & 0x3f | 0x80;
                      pbVar31[2] = (byte)(uVar15 >> 6) & 0x3f | 0x80;
                      pbVar31[3] = bVar34 & 0x3f | 0x80;
                      lVar24 = 4;
                    }
                  }
                  else {
                    if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                        [pbVar33[1]] == 0) {
                      uVar25 = 5;
                      goto LAB_001550eb;
                    }
                    *pbVar31 = simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                               [pbVar33[1]];
                    pbVar32 = pbVar33 + 2;
                  }
                }
                else {
                  if (bVar34 == 0x22) goto LAB_00151f4d;
                  pbVar32 = pbVar33 + 1;
                }
                pbVar31 = pbVar31 + lVar24;
                pbVar33 = pbVar32;
              } while( true );
            }
            local_838[0]._8_4_ = 0x13;
          }
          else {
            iVar14 = *(depth_t *)(local_848._M_len + 0x24);
            if (iVar14 < iVar28) {
              if (iVar28 + -1 <= iVar14) {
                *(int *)(local_848._M_len + 0x24) = iVar28;
                *(uint **)(local_848._M_len + 8) = (uint *)(local_838[0]._M_allocated_capacity + 4);
                simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                          ((value_iterator *)local_8a8);
                ((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
                super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>
                .super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl
                [(int)local_8a8._8_4_] = local_898;
                puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
                if (((token_iterator *)local_8a8._0_8_)->buf[*puVar19] != '}') goto LAB_00151818;
                ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
                if (local_8a8._8_4_ - 1 < 0x7ffffffe) {
                  if (*(depth_t *)(local_8a8._0_8_ + 0x24) == local_8a8._8_4_) {
                    *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
                    bVar22 = false;
                    goto LAB_00151959;
                  }
                  goto LAB_001558b3;
                }
                goto LAB_00155894;
              }
              local_838[0]._8_4_ = 0x19;
            }
            else {
              if (iVar28 < iVar14) {
                puVar18 = puVar19 + 1;
                *(uint **)(local_848._M_len + 8) = puVar18;
                cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar19);
                if ((((cVar2 != ',') && (cVar2 != ':')) && (cVar2 != '[')) &&
                   ((cVar2 == '}' || (cVar2 != '{')))) {
                  iVar14 = iVar14 + -1;
                  *(int *)(local_848._M_len + 0x24) = iVar14;
                  if (iVar14 <= iVar28) goto LAB_001518dd;
                }
LAB_00151889:
                do {
                  while( true ) {
                    _Var8._M_head_impl =
                         ((*(parser **)(local_848._M_len + 0x10))->implementation)._M_t.
                         super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                         .
                         super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>
                         ._M_head_impl;
                    if ((uint *)((ulong)(_Var8._M_head_impl)->n_structural_indexes * 4 +
                                (long)((_Var8._M_head_impl)->structural_indexes)._M_t) <= puVar18) {
                      *(long *)(local_848._M_len + 0x20) = 3;
                      *(parser **)(local_848._M_len + 0x10) = (parser *)0x0;
                      local_838[0]._8_4_ = 3;
                      goto LAB_00154ce3;
                    }
                    puVar19 = puVar18 + 1;
                    *(uint **)(local_848._M_len + 8) = puVar19;
                    cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar18);
                    puVar18 = puVar19;
                    if (cVar2 != '[') break;
LAB_001518cd:
                    iVar14 = iVar14 + 1;
                    *(int *)(local_848._M_len + 0x24) = iVar14;
                  }
                  if ((cVar2 != ']') && (cVar2 != '}')) {
                    if (cVar2 == '{') goto LAB_001518cd;
                    goto LAB_00151889;
                  }
                  iVar14 = iVar14 + -1;
                  *(int *)(local_848._M_len + 0x24) = iVar14;
                } while (iVar28 < iVar14);
              }
LAB_001518dd:
              simdjson::fallback::ondemand::value_iterator::assert_at_next
                        ((value_iterator *)local_8a8);
              puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
              ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
              uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
              bVar22 = true;
              if (uVar1 != ',') {
                if (uVar1 != '}') {
                  *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
                  *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
                  local_838[0]._8_4_ = 3;
                  goto LAB_00154ce3;
                }
                if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
                if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
                *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
                bVar22 = false;
              }
              if (((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
                  super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>
                  .super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl
                  [(int)local_8a8._8_4_] == local_898) {
                bVar35 = false;
                goto LAB_00151959;
              }
              local_838[0]._8_4_ = 0x19;
            }
          }
LAB_00154ce3:
          local_848._M_len = 0;
          local_848._M_str = (char *)0x0;
          local_838[0]._M_allocated_capacity = (uint *)0x0;
          puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
          uVar25 = local_838[0]._8_4_;
LAB_00154cff:
          *puVar20 = &PTR__exception_001efe80;
          *(undefined4 *)(puVar20 + 1) = uVar25;
          __cxa_throw(puVar20,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
        }
LAB_00155208:
        uVar25 = 0x10;
      }
      else {
        if ((lVar24 == 8) || (lVar24 == 4)) {
          if (((token_iterator *)local_7c8._M_len)->buf[*(uint *)local_838[0]._0_8_] == '{')
          goto LAB_00151702;
          goto LAB_00155208;
        }
        uVar25 = 0x19;
      }
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      goto LAB_00155280;
    }
    if (local_7b0 != SUCCESS) {
LAB_001551e7:
      local_848._M_len = 0;
      local_848._M_str = (char *)0x0;
      local_838[0]._M_allocated_capacity = (uint *)0x0;
      local_838[0]._8_4_ = eVar13;
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      uVar25 = local_838[0]._8_4_;
LAB_00155280:
      *puVar20 = &PTR__exception_001efe80;
      *(undefined4 *)(puVar20 + 1) = uVar25;
      __cxa_throw(puVar20,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
    }
LAB_001549fc:
    in_RCX = (json_iterator *)local_7c8._M_len;
    simdjson::fallback::ondemand::parser::~parser((parser *)local_6f0);
    simdjson::padded_string::~padded_string(&p_d);
    Client<hedg::Rest_Client>::~Client((Client<hedg::Rest_Client> *)&e);
    boost::asio::ssl::context::~context(&context);
    boost::asio::execution_context::~execution_context(&service.super_execution_context);
    std::__cxx11::string::~string((string *)&end_time);
    std::__cxx11::string::~string((string *)&start_time);
    this_00 = local_700;
    pthread_mutex_unlock(local_700);
    std::condition_variable::notify_all();
    e._0_8_ = calc_time(local_6f8);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>((duration<long,_std::ratio<1L,_1L>_> *)&e);
  } while( true );
LAB_00151f4d:
  local_768.market_start_time_._M_string_length = (size_type)pjVar21->_string_buf_loc;
  pjVar21->_string_buf_loc = pbVar31;
  local_768.market_start_time_._M_dataplus._M_p =
       (pointer)((long)pbVar31 - local_768.market_start_time_._M_string_length);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&m_id,(basic_string_view<char,_std::char_traits<char>_> *)&local_768,
             (allocator<char> *)&m_tm);
  local_850 = ((token_iterator *)local_8a8._0_8_)->_position;
  bVar12 = local_848;
  if (local_850 <= local_898) goto LAB_001558dc;
  local_86c = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  if (local_850 == local_898 + 1) {
LAB_00152046:
    bVar35 = true;
  }
  else {
    iVar28 = *(depth_t *)(local_8a8._0_8_ + 0x24);
    if (iVar28 < (int)local_8a8._8_4_) {
      if (iVar28 < local_8a8._8_4_ + -1) {
        local_838[0]._8_4_ = 0x19;
        goto LAB_00154a6a;
      }
      *(undefined4 *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_;
      ((token_iterator *)local_8a8._0_8_)->_position = local_898 + 1;
      simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                ((value_iterator *)local_8a8);
      ((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
      super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>._M_t
      .super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
      super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_8a8._8_4_] =
           local_898;
      puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
      if (((token_iterator *)local_8a8._0_8_)->buf[*puVar19] == '}') {
        ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
        uVar30 = local_8a8._8_4_ - 1;
        if (0x7ffffffd < uVar30) goto LAB_00155894;
        if (*(depth_t *)(local_8a8._0_8_ + 0x24) == local_8a8._8_4_) goto LAB_00152343;
        goto LAB_001558b3;
      }
      goto LAB_00152046;
    }
    if ((int)local_8a8._8_4_ < iVar28) {
      puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
      puVar19 = local_850 + 1;
      ((token_iterator *)local_8a8._0_8_)->_position = puVar19;
      uVar1 = puVar3[*local_850];
      if (((uVar1 != ',') && (uVar1 != ':')) &&
         ((uVar1 != '[' && ((uVar1 == '}' || (uVar1 != '{')))))) {
        iVar28 = iVar28 + -1;
        *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
        local_850 = puVar19;
        if (iVar28 <= (int)local_8a8._8_4_) goto LAB_001520f4;
      }
      ppVar5 = *(parser **)(local_8a8._0_8_ + 0x10);
LAB_00152099:
      do {
        while( true ) {
          pdVar6 = (ppVar5->implementation)._M_t.
                   super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                   _M_head_impl;
          if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                      (long)(pdVar6->structural_indexes)._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                      ) <= puVar19) {
            *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
            *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
            local_838[0]._8_4_ = 3;
            goto LAB_00154a6a;
          }
          local_850 = puVar19 + 1;
          ((token_iterator *)local_8a8._0_8_)->_position = local_850;
          uVar1 = puVar3[*puVar19];
          puVar19 = local_850;
          if (uVar1 != '[') break;
LAB_001520dd:
          iVar28 = iVar28 + 1;
          *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
        }
        if ((uVar1 != ']') && (uVar1 != '}')) {
          if (uVar1 == '{') goto LAB_001520dd;
          goto LAB_00152099;
        }
        iVar28 = iVar28 + -1;
        *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
      } while ((int)local_8a8._8_4_ < iVar28);
    }
LAB_001520f4:
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
    bVar35 = true;
    if (uVar1 != ',') {
      if (uVar1 != '}') {
LAB_00154fbf:
        *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
        *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
        local_838[0]._8_4_ = 3;
        goto LAB_00154a6a;
      }
      if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
      *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
      bVar35 = false;
    }
    if (((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
        super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
        super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_8a8._8_4_] !=
        local_898) {
      local_838[0]._8_4_ = 0x19;
      goto LAB_00154a6a;
    }
    local_86c = 0;
  }
  while (bVar35) {
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_0015583e;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar26 = (ulong)*puVar19;
    if (puVar3[uVar26] != '\"') goto LAB_00154fbf;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    pjVar21 = (json_iterator *)local_8a8._0_8_;
    puVar4 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    if (puVar4[*puVar19] != ':') {
      *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
      *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
      local_838[0]._8_4_ = 3;
      goto LAB_00154a6a;
    }
    uVar25 = local_8a8._8_4_;
    if (0x7ffffffd < (uint)local_8a8._8_4_) goto LAB_0015581f;
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_00155800;
    iVar28 = local_8a8._8_4_ + 1;
    *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
    if ((puVar3[uVar26 + 0x10] == '\"') &&
       (iVar14 = bcmp(puVar3 + uVar26 + 1,"marketStartTime",0xf), iVar14 == 0)) goto LAB_0015259d;
    if (puVar19 + 1 <= local_898) goto LAB_00155861;
    (pjVar21->token)._position = puVar19 + 2;
    uVar30 = puVar4[puVar19[1]] - 0x2c;
    if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
       (puVar4[puVar19[1]] == 0x7b)) {
      ppVar5 = *(parser **)((long)pjVar21 + 0x10);
      puVar19 = puVar19 + 2;
LAB_00152282:
      do {
        while( true ) {
          pdVar6 = (ppVar5->implementation)._M_t.
                   super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                   _M_head_impl;
          if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                      (long)(pdVar6->structural_indexes)._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                      ) <= puVar19) goto LAB_00154a57;
          puVar18 = puVar19 + 1;
          (pjVar21->token)._position = puVar18;
          uVar1 = puVar4[*puVar19];
          puVar19 = puVar18;
          if (uVar1 != '[') break;
LAB_001522c0:
          iVar28 = iVar28 + 1;
          *(int *)((long)pjVar21 + 0x24) = iVar28;
        }
        if ((uVar1 != ']') && (uVar1 != '}')) {
          if (uVar1 == '{') goto LAB_001522c0;
          goto LAB_00152282;
        }
        iVar28 = iVar28 + -1;
        *(int *)((long)pjVar21 + 0x24) = iVar28;
      } while ((int)uVar25 < iVar28);
    }
    else {
      *(undefined4 *)((long)pjVar21 + 0x24) = uVar25;
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
    bVar35 = true;
    if (uVar1 != ',') {
      if (uVar1 != '}') {
        *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
        *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
        local_838[0]._8_4_ = 3;
        goto LAB_00154a6a;
      }
      uVar30 = local_8a8._8_4_ - 1;
      if (0x7ffffffd < uVar30) goto LAB_00155894;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
LAB_00152343:
      *(uint *)(local_8a8._0_8_ + 0x24) = uVar30;
      bVar35 = false;
    }
  }
  if ((char)local_86c == '\0') {
    *(undefined4 *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_;
    ((token_iterator *)local_8a8._0_8_)->_position = local_898 + 1;
    simdjson::fallback::ondemand::value_iterator::assert_at_container_start
              ((value_iterator *)local_8a8);
    ((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
    super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>._M_t.
    super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
    super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_8a8._8_4_] =
         local_898;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    bVar35 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19] != '}';
    if (!bVar35) {
      ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
      if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
      *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
    }
    while( true ) {
      if (!bVar35) goto LAB_0015576e;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_0015574f;
      simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
      puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
      puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
      ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
      uVar26 = (ulong)*puVar19;
      pjVar21 = (json_iterator *)local_8a8._0_8_;
      if (puVar3[uVar26] != '\"') goto LAB_0015566f;
      simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
      pjVar21 = (json_iterator *)local_8a8._0_8_;
      puVar4 = ((token_iterator *)local_8a8._0_8_)->buf;
      puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
      ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
      if (puVar4[*puVar19] != ':') goto LAB_00155695;
      uVar25 = local_8a8._8_4_;
      if (0x7ffffffd < (uint)local_8a8._8_4_) goto LAB_0015581f;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_00155800;
      iVar28 = local_8a8._8_4_ + 1;
      *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
      if ((puVar3[uVar26 + 0x10] == '\"') &&
         (iVar14 = bcmp(puVar3 + uVar26 + 1,"marketStartTime",0xf), iVar14 == 0)) break;
      if (puVar19 + 1 <= local_898) goto LAB_00155861;
      puVar18 = puVar19 + 2;
      (pjVar21->token)._position = puVar18;
      uVar30 = puVar4[puVar19[1]] - 0x2c;
      if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
         (puVar4[puVar19[1]] == 0x7b)) {
        ppVar5 = *(parser **)((long)pjVar21 + 0x10);
        puVar19 = puVar18;
LAB_001524d1:
        do {
          while( true ) {
            pdVar6 = (ppVar5->implementation)._M_t.
                     super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                     .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                     _M_head_impl;
            if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                        (long)(pdVar6->structural_indexes)._M_t.
                              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                        ) <= puVar19) goto LAB_00154a57;
            puVar18 = puVar19 + 1;
            (pjVar21->token)._position = puVar18;
            uVar1 = puVar4[*puVar19];
            puVar19 = puVar18;
            if (uVar1 != '[') break;
LAB_0015250f:
            iVar28 = iVar28 + 1;
            *(int *)((long)pjVar21 + 0x24) = iVar28;
          }
          if ((uVar1 != ']') && (uVar1 != '}')) {
            if (uVar1 == '{') goto LAB_0015250f;
            goto LAB_001524d1;
          }
          iVar28 = iVar28 + -1;
          *(int *)((long)pjVar21 + 0x24) = iVar28;
        } while ((int)uVar25 < iVar28);
      }
      else {
        *(undefined4 *)((long)pjVar21 + 0x24) = uVar25;
      }
      if (puVar18 == local_850) {
        local_838[0]._8_4_ = 0x13;
        goto LAB_00154a6a;
      }
      simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
      puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
      ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
      uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
      bVar35 = true;
      if (uVar1 != ',') {
        pjVar21 = (json_iterator *)local_8a8._0_8_;
        if (uVar1 != '}') goto LAB_0015569f;
        if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
        if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
        *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
        bVar35 = false;
      }
    }
LAB_0015259d:
    simdjson::fallback::ondemand::value_iterator::assert_at_child((value_iterator *)local_8a8);
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    local_848._M_str._0_4_ = local_8a8._8_4_ + 1;
    local_848._M_len = local_8a8._0_8_;
    local_838[0]._8_4_ = 0;
    puVar18 = ((token_iterator *)local_8a8._0_8_)->_position;
    pjVar21 = (json_iterator *)local_8a8._0_8_;
    local_838[0]._0_8_ = puVar19;
    if (puVar18 == puVar19) {
      simdjson::fallback::ondemand::value_iterator::assert_at_start((value_iterator *)&local_848);
      puVar19 = *(token_position *)(local_848._M_len + 8);
      puVar18 = puVar19;
      pjVar21 = (json_iterator *)local_848._M_len;
    }
    puVar3 = (pjVar21->token).buf;
    uVar30 = *puVar19;
    if (puVar3[uVar30] == '\"') {
      if (puVar18 == (uint *)local_838[0]._0_8_) {
        simdjson::fallback::ondemand::value_iterator::assert_at_start((value_iterator *)&local_848);
        *(token_position *)(local_848._M_len + 8) = *(token_position *)(local_848._M_len + 8) + 1;
        if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
        if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
        *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
        pjVar21 = (json_iterator *)local_848._M_len;
      }
      pbVar31 = pjVar21->_string_buf_loc;
      pbVar33 = puVar3 + (ulong)uVar30 + 1;
      do {
        lVar24 = 1;
        bVar34 = *pbVar33;
        *pbVar31 = bVar34;
        if (bVar34 == 0x5c) {
          if ((ulong)pbVar33[1] == 0x75) {
            uVar15 = simdjson::fallback::anon_unknown_0::jsoncharutils::hex_to_u32_nocheck
                               (pbVar33 + 2);
            pbVar32 = pbVar33 + 6;
            if ((uVar15 & 0xfffffc00) == 0xd800) {
              if (((*pbVar32 == 0x5c) && (pbVar33[7] == 0x75)) &&
                 (uVar16 = simdjson::fallback::anon_unknown_0::jsoncharutils::hex_to_u32_nocheck
                                     (pbVar33 + 8), uVar16 < 0x10000)) {
                uVar15 = (uVar16 - 0xdc00 | uVar15 * 0x400 + 0xfca00000) + 0x10000;
                pbVar32 = pbVar33 + 0xc;
                goto LAB_001526d5;
              }
LAB_00154f37:
              uVar25 = 5;
              goto LAB_0015510b;
            }
LAB_001526d5:
            lVar24 = 1;
            bVar34 = (byte)uVar15;
            if (uVar15 < 0x80) {
              *pbVar31 = bVar34;
            }
            else if (uVar15 < 0x800) {
              *pbVar31 = (byte)(uVar15 >> 6) | 0xc0;
              pbVar31[1] = bVar34 & 0x3f | 0x80;
              lVar24 = 2;
            }
            else if (uVar15 < 0x10000) {
              *pbVar31 = (byte)(uVar15 >> 0xc) | 0xe0;
              pbVar31[1] = (byte)(uVar15 >> 6) & 0x3f | 0x80;
              pbVar31[2] = bVar34 & 0x3f | 0x80;
              lVar24 = 3;
            }
            else {
              if (0x10ffff < uVar15) goto LAB_00154f37;
              *pbVar31 = (byte)(uVar15 >> 0x12) | 0xf0;
              pbVar31[1] = (byte)(uVar15 >> 0xc) & 0x3f | 0x80;
              pbVar31[2] = (byte)(uVar15 >> 6) & 0x3f | 0x80;
              pbVar31[3] = bVar34 & 0x3f | 0x80;
              lVar24 = 4;
            }
          }
          else {
            if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map[pbVar33[1]] ==
                0) {
              uVar25 = 5;
              goto LAB_0015510b;
            }
            *pbVar31 = simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                       [pbVar33[1]];
            pbVar32 = pbVar33 + 2;
          }
        }
        else {
          if (bVar34 == 0x22) goto LAB_001527bb;
          pbVar32 = pbVar33 + 1;
        }
        pbVar31 = pbVar31 + lVar24;
        pbVar33 = pbVar32;
      } while( true );
    }
    uVar25 = 0x10;
LAB_0015510b:
    puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
    goto LAB_00154a86;
  }
  local_838[0]._8_4_ = 0x13;
  goto LAB_00154a6a;
LAB_001527bb:
  local_768.market_start_time_._M_string_length = (size_type)pjVar21->_string_buf_loc;
  pjVar21->_string_buf_loc = pbVar31;
  local_768.market_start_time_._M_dataplus._M_p =
       (pointer)((long)pbVar31 - local_768.market_start_time_._M_string_length);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&m_tm,(basic_string_view<char,_std::char_traits<char>_> *)&local_768,
             (allocator<char> *)&event_type);
  local_850 = ((token_iterator *)local_8a8._0_8_)->_position;
  bVar12 = local_848;
  if (local_850 <= local_898) goto LAB_001558dc;
  local_86c = (undefined4)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
  if (local_850 == local_898 + 1) {
LAB_001528b4:
    bVar35 = true;
  }
  else {
    iVar28 = *(depth_t *)(local_8a8._0_8_ + 0x24);
    if (iVar28 < (int)local_8a8._8_4_) {
      if (iVar28 < local_8a8._8_4_ + -1) {
        local_768.market_start_time_.field_2._8_4_ = 0x19;
        goto LAB_00154ac1;
      }
      *(undefined4 *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_;
      ((token_iterator *)local_8a8._0_8_)->_position = local_898 + 1;
      simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                ((value_iterator *)local_8a8);
      ((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
      super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>._M_t
      .super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
      super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_8a8._8_4_] =
           local_898;
      puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
      if (((token_iterator *)local_8a8._0_8_)->buf[*puVar19] == '}') {
        ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
        uVar30 = local_8a8._8_4_ - 1;
        if (0x7ffffffd < uVar30) goto LAB_00155894;
        if (*(depth_t *)(local_8a8._0_8_ + 0x24) == local_8a8._8_4_) goto LAB_00152bb1;
        goto LAB_001558b3;
      }
      goto LAB_001528b4;
    }
    if ((int)local_8a8._8_4_ < iVar28) {
      puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
      puVar19 = local_850 + 1;
      ((token_iterator *)local_8a8._0_8_)->_position = puVar19;
      uVar1 = puVar3[*local_850];
      if (((uVar1 != ',') && (uVar1 != ':')) &&
         ((uVar1 != '[' && ((uVar1 == '}' || (uVar1 != '{')))))) {
        iVar28 = iVar28 + -1;
        *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
        local_850 = puVar19;
        if (iVar28 <= (int)local_8a8._8_4_) goto LAB_00152962;
      }
      ppVar5 = *(parser **)(local_8a8._0_8_ + 0x10);
LAB_00152907:
      do {
        while( true ) {
          pdVar6 = (ppVar5->implementation)._M_t.
                   super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                   _M_head_impl;
          if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                      (long)(pdVar6->structural_indexes)._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                      ) <= puVar19) {
            *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
            *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
            local_768.market_start_time_.field_2._8_4_ = 3;
            goto LAB_00154ac1;
          }
          local_850 = puVar19 + 1;
          ((token_iterator *)local_8a8._0_8_)->_position = local_850;
          uVar1 = puVar3[*puVar19];
          puVar19 = local_850;
          if (uVar1 != '[') break;
LAB_0015294b:
          iVar28 = iVar28 + 1;
          *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
        }
        if ((uVar1 != ']') && (uVar1 != '}')) {
          if (uVar1 == '{') goto LAB_0015294b;
          goto LAB_00152907;
        }
        iVar28 = iVar28 + -1;
        *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
      } while ((int)local_8a8._8_4_ < iVar28);
    }
LAB_00152962:
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
    bVar35 = true;
    if (uVar1 != ',') {
      if (uVar1 != '}') {
LAB_00155008:
        *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
        *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
        local_768.market_start_time_.field_2._8_4_ = 3;
        goto LAB_00154ac1;
      }
      if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
      *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
      bVar35 = false;
    }
    if (((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
        super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
        super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_8a8._8_4_] !=
        local_898) {
      local_768.market_start_time_.field_2._8_4_ = 0x19;
      goto LAB_00154ac1;
    }
    local_86c = 0;
  }
  while (bVar35) {
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_0015583e;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar26 = (ulong)*puVar19;
    if (puVar3[uVar26] != '\"') goto LAB_00155008;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    pjVar21 = (json_iterator *)local_8a8._0_8_;
    puVar4 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    if (puVar4[*puVar19] != ':') {
      *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
      *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
      local_768.market_start_time_.field_2._8_4_ = 3;
      goto LAB_00154ac1;
    }
    uVar25 = local_8a8._8_4_;
    if (0x7ffffffd < (uint)local_8a8._8_4_) goto LAB_0015581f;
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_00155800;
    iVar28 = local_8a8._8_4_ + 1;
    *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
    if ((puVar3[uVar26 + 10] == '\"') &&
       (iVar14 = bcmp(puVar3 + uVar26 + 1,"eventType",9), iVar14 == 0)) goto LAB_00152e10;
    if (puVar19 + 1 <= local_898) goto LAB_00155861;
    (pjVar21->token)._position = puVar19 + 2;
    uVar30 = puVar4[puVar19[1]] - 0x2c;
    if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
       (puVar4[puVar19[1]] == 0x7b)) {
      ppVar5 = *(parser **)((long)pjVar21 + 0x10);
      puVar19 = puVar19 + 2;
LAB_00152af0:
      do {
        while( true ) {
          pdVar6 = (ppVar5->implementation)._M_t.
                   super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                   _M_head_impl;
          if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                      (long)(pdVar6->structural_indexes)._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                      ) <= puVar19) goto LAB_00154aae;
          puVar18 = puVar19 + 1;
          (pjVar21->token)._position = puVar18;
          uVar1 = puVar4[*puVar19];
          puVar19 = puVar18;
          if (uVar1 != '[') break;
LAB_00152b2e:
          iVar28 = iVar28 + 1;
          *(int *)((long)pjVar21 + 0x24) = iVar28;
        }
        if ((uVar1 != ']') && (uVar1 != '}')) {
          if (uVar1 == '{') goto LAB_00152b2e;
          goto LAB_00152af0;
        }
        iVar28 = iVar28 + -1;
        *(int *)((long)pjVar21 + 0x24) = iVar28;
      } while ((int)uVar25 < iVar28);
    }
    else {
      *(undefined4 *)((long)pjVar21 + 0x24) = uVar25;
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
    bVar35 = true;
    if (uVar1 != ',') {
      if (uVar1 != '}') {
        *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
        *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
        local_768.market_start_time_.field_2._8_4_ = 3;
        goto LAB_00154ac1;
      }
      uVar30 = local_8a8._8_4_ - 1;
      if (0x7ffffffd < uVar30) goto LAB_00155894;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
LAB_00152bb1:
      *(uint *)(local_8a8._0_8_ + 0x24) = uVar30;
      bVar35 = false;
    }
  }
  if ((char)local_86c != '\0') {
    local_768.market_start_time_.field_2._8_4_ = 0x13;
    goto LAB_00154ac1;
  }
  *(undefined4 *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_;
  ((token_iterator *)local_8a8._0_8_)->_position = local_898 + 1;
  simdjson::fallback::ondemand::value_iterator::assert_at_container_start
            ((value_iterator *)local_8a8);
  ((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
  super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
  super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_8a8._8_4_] = local_898
  ;
  puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
  bVar35 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19] != '}';
  if (!bVar35) {
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
    *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
  }
  while( true ) {
    if (!bVar35) goto LAB_0015576e;
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_0015574f;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar26 = (ulong)*puVar19;
    pjVar21 = (json_iterator *)local_8a8._0_8_;
    if (puVar3[uVar26] != '\"') goto LAB_0015566f;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    pjVar21 = (json_iterator *)local_8a8._0_8_;
    puVar4 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    if (puVar4[*puVar19] != ':') goto LAB_00155695;
    uVar25 = local_8a8._8_4_;
    if (0x7ffffffd < (uint)local_8a8._8_4_) goto LAB_0015581f;
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_00155800;
    iVar28 = local_8a8._8_4_ + 1;
    *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
    if ((puVar3[uVar26 + 10] == '\"') &&
       (iVar14 = bcmp(puVar3 + uVar26 + 1,"eventType",9), iVar14 == 0)) break;
    if (puVar19 + 1 <= local_898) goto LAB_00155861;
    puVar18 = puVar19 + 2;
    (pjVar21->token)._position = puVar18;
    uVar30 = puVar4[puVar19[1]] - 0x2c;
    if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
       (puVar4[puVar19[1]] == 0x7b)) {
      ppVar5 = *(parser **)((long)pjVar21 + 0x10);
      puVar19 = puVar18;
LAB_00152d3f:
      do {
        while( true ) {
          pdVar6 = (ppVar5->implementation)._M_t.
                   super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                   _M_head_impl;
          if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                      (long)(pdVar6->structural_indexes)._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                      ) <= puVar19) goto LAB_00154aae;
          puVar18 = puVar19 + 1;
          (pjVar21->token)._position = puVar18;
          uVar1 = puVar4[*puVar19];
          puVar19 = puVar18;
          if (uVar1 != '[') break;
LAB_00152d7d:
          iVar28 = iVar28 + 1;
          *(int *)((long)pjVar21 + 0x24) = iVar28;
        }
        if ((uVar1 != ']') && (uVar1 != '}')) {
          if (uVar1 == '{') goto LAB_00152d7d;
          goto LAB_00152d3f;
        }
        iVar28 = iVar28 + -1;
        *(int *)((long)pjVar21 + 0x24) = iVar28;
      } while ((int)uVar25 < iVar28);
    }
    else {
      *(undefined4 *)((long)pjVar21 + 0x24) = uVar25;
    }
    if (puVar18 == local_850) {
      local_768.market_start_time_.field_2._8_4_ = 0x13;
      goto LAB_00154ac1;
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
    bVar35 = true;
    if (uVar1 != ',') {
      pjVar21 = (json_iterator *)local_8a8._0_8_;
      if (uVar1 != '}') goto LAB_0015569f;
      if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
      *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
      bVar35 = false;
    }
  }
LAB_00152e10:
  simdjson::fallback::ondemand::value_iterator::assert_at_child((value_iterator *)local_8a8);
  country_code.field_2._M_allocated_capacity = *(size_type *)(local_8a8._0_8_ + 8);
  country_code._M_string_length._0_4_ = local_8a8._8_4_ + 1;
  country_code._M_dataplus._M_p = (pointer)local_8a8._0_8_;
  country_code.field_2._8_4_ = 0;
  if (*(size_type *)(local_8a8._0_8_ + 8) == country_code.field_2._M_allocated_capacity) {
    simdjson::fallback::ondemand::value_iterator::assert_at_start((value_iterator *)&country_code);
    if (*(char *)(*(long *)country_code._M_dataplus._M_p +
                 (ulong)**(uint **)(country_code._M_dataplus._M_p + 8)) == '{') {
      *(uint **)(country_code._M_dataplus._M_p + 8) =
           *(uint **)(country_code._M_dataplus._M_p + 8) + 1;
      simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                ((value_iterator *)&country_code);
      *(size_type *)
       (*(long *)(*(long *)(country_code._M_dataplus._M_p + 0x10) + 0x30) +
       (long)(int)country_code._M_string_length * 8) = country_code.field_2._M_allocated_capacity;
      if (*(char *)(*(long *)country_code._M_dataplus._M_p +
                   (ulong)**(uint **)(country_code._M_dataplus._M_p + 8)) == '}') {
        *(uint **)(country_code._M_dataplus._M_p + 8) =
             *(uint **)(country_code._M_dataplus._M_p + 8) + 1;
        if (0x7ffffffd < (int)country_code._M_string_length - 1U) goto LAB_00155894;
        if (*(int *)(country_code._M_dataplus._M_p + 0x24) != (int)country_code._M_string_length)
        goto LAB_001558b3;
        *(uint *)(country_code._M_dataplus._M_p + 0x24) = (int)country_code._M_string_length - 1U;
      }
      goto LAB_00152ef8;
    }
    local_768.market_start_time_.field_2._8_4_ = 0x10;
  }
  else {
LAB_00152ef8:
    local_848._M_len = (size_t)country_code._M_dataplus._M_p;
    local_848._M_str = (char *)country_code._M_string_length;
    bVar12 = local_848;
    local_838[0]._M_allocated_capacity = country_code.field_2._M_allocated_capacity;
    local_838[0]._8_4_ = 0;
    local_848._M_len = country_code._M_dataplus._M_p;
    puVar19 = *(uint **)(local_848._M_len + 8);
    if (puVar19 <= country_code.field_2._M_allocated_capacity) goto LAB_001558dc;
    bVar35 = true;
    plVar17 = (long *)local_848._M_len;
    puVar18 = puVar19;
    if (puVar19 == (uint *)(country_code.field_2._M_allocated_capacity + 4)) {
LAB_00152fdb:
      local_848 = bVar12;
      bVar22 = true;
    }
    else {
      iVar28 = *(int *)(local_848._M_len + 0x24);
      local_848._M_str._0_4_ = (uint)country_code._M_string_length;
      local_848 = bVar12;
      if (iVar28 < (int)(uint)local_848._M_str) {
        if (iVar28 < (int)((uint)local_848._M_str + -1)) {
          local_768.market_start_time_.field_2._8_4_ = 0x19;
          goto LAB_00154d3e;
        }
        *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str;
        *(uint **)(local_848._M_len + 8) = (uint *)(country_code.field_2._M_allocated_capacity + 4);
        simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                  ((value_iterator *)&local_848);
        *(undefined8 *)
         (*(long *)(*(long *)(local_848._M_len + 0x10) + 0x30) +
         (long)(int)(uint)local_848._M_str * 8) = local_838[0]._M_allocated_capacity;
        plVar17 = (long *)local_848._M_len;
        bVar12 = local_848;
        if (*(char *)(*(long *)local_848._M_len + (ulong)**(uint **)(local_848._M_len + 8)) != '}')
        goto LAB_00152fdb;
        *(uint **)(local_848._M_len + 8) = *(uint **)(local_848._M_len + 8) + 1;
        if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
        if (*(int *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
        *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
        bVar22 = false;
      }
      else {
        if ((int)(uint)local_848._M_str < iVar28) {
          puVar18 = puVar19 + 1;
          *(uint **)(local_848._M_len + 8) = puVar18;
          cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar19);
          if ((((cVar2 != ',') && (cVar2 != ':')) && (cVar2 != '[')) &&
             ((cVar2 == '}' || (cVar2 != '{')))) {
            iVar28 = iVar28 + -1;
            *(int *)(local_848._M_len + 0x24) = iVar28;
            if (iVar28 <= (int)(uint)local_848._M_str) goto LAB_0015309c;
          }
LAB_00153048:
          do {
            while( true ) {
              if ((uint *)((ulong)*(uint *)(*(long *)(*(long *)(local_848._M_len + 0x10) + 8) + 8) *
                           4 + *(long *)(*(long *)(*(long *)(local_848._M_len + 0x10) + 8) + 0x10))
                  <= puVar18) {
                *(long *)(local_848._M_len + 0x20) = 3;
                *(long *)(local_848._M_len + 0x10) = 0;
                local_768.market_start_time_.field_2._8_4_ = 3;
                goto LAB_00154d3e;
              }
              puVar19 = puVar18 + 1;
              *(uint **)(local_848._M_len + 8) = puVar19;
              cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar18);
              puVar18 = puVar19;
              if (cVar2 != '[') break;
LAB_0015308c:
              iVar28 = iVar28 + 1;
              *(int *)(local_848._M_len + 0x24) = iVar28;
            }
            if ((cVar2 != ']') && (cVar2 != '}')) {
              if (cVar2 == '{') goto LAB_0015308c;
              goto LAB_00153048;
            }
            iVar28 = iVar28 + -1;
            *(int *)(local_848._M_len + 0x24) = iVar28;
          } while ((int)(uint)local_848._M_str < iVar28);
        }
LAB_0015309c:
        simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
        puVar19 = *(uint **)(local_848._M_len + 8);
        *(uint **)(local_848._M_len + 8) = puVar19 + 1;
        cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar19);
        bVar22 = true;
        if (cVar2 != ',') {
          if (cVar2 != '}') {
            *(long *)(local_848._M_len + 0x20) = 3;
            *(long *)(local_848._M_len + 0x10) = 0;
            local_768.market_start_time_.field_2._8_4_ = 3;
            goto LAB_00154d3e;
          }
          if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
          if (*(int *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
          *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
          bVar22 = false;
        }
        if (*(uint **)(*(long *)(*(long *)(local_848._M_len + 0x10) + 0x30) +
                      (long)(int)(uint)local_848._M_str * 8) != (uint *)local_838[0]._0_8_) {
          local_768.market_start_time_.field_2._8_4_ = 0x19;
          goto LAB_00154d3e;
        }
        bVar35 = false;
        plVar17 = (long *)local_848._M_len;
      }
    }
    while (bVar22) {
      if (*(int *)((long)plVar17 + 0x24) != (uint)local_848._M_str) goto LAB_0015583e;
      simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
      lVar24 = *(long *)local_848._M_len;
      puVar19 = *(uint **)(local_848._M_len + 8);
      *(uint **)(local_848._M_len + 8) = puVar19 + 1;
      uVar26 = (ulong)*puVar19;
      if (*(char *)(lVar24 + uVar26) != '\"') {
LAB_00154ee7:
        *(long *)(local_848._M_len + 0x20) = 3;
        *(long *)(local_848._M_len + 0x10) = 0;
        local_768.market_start_time_.field_2._8_4_ = 3;
        goto LAB_00154d3e;
      }
      simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
      lVar7 = *(long *)local_848._M_len;
      puVar19 = *(uint **)(local_848._M_len + 8);
      *(uint **)(local_848._M_len + 8) = puVar19 + 1;
      if (*(char *)(lVar7 + (ulong)*puVar19) != ':') goto LAB_00154ee7;
      if (0x7ffffffd < (uint)local_848._M_str) goto LAB_0015581f;
      if (*(uint *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_00155800;
      lVar24 = lVar24 + uVar26;
      iVar28 = (uint)local_848._M_str + 1;
      *(int *)(local_848._M_len + 0x24) = iVar28;
      if ((*(char *)(lVar24 + 3) == '\"') && (*(short *)(lVar24 + 1) == 0x6469)) goto LAB_00153505;
      if (puVar19 + 1 <= (ulong)local_838[0]._0_8_) goto LAB_00155861;
      *(uint **)(local_848._M_len + 8) = puVar19 + 2;
      uVar30 = *(byte *)(lVar7 + (ulong)puVar19[1]) - 0x2c;
      if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
         (*(byte *)(lVar7 + (ulong)puVar19[1]) == 0x7b)) {
        puVar19 = puVar19 + 2;
LAB_0015320a:
        do {
          while( true ) {
            if ((uint *)((ulong)*(uint *)(*(long *)(*(long *)(local_848._M_len + 0x10) + 8) + 8) * 4
                        + *(long *)(*(long *)(*(long *)(local_848._M_len + 0x10) + 8) + 0x10)) <=
                puVar19) {
              *(undefined4 *)(local_848._M_len + 0x20) = 3;
              goto LAB_00154d2e;
            }
            puVar29 = puVar19 + 1;
            *(uint **)(local_848._M_len + 8) = puVar29;
            cVar2 = *(char *)(lVar7 + (ulong)*puVar19);
            puVar19 = puVar29;
            if (cVar2 != '[') break;
LAB_0015324e:
            iVar28 = iVar28 + 1;
            *(int *)(local_848._M_len + 0x24) = iVar28;
          }
          if ((cVar2 != ']') && (cVar2 != '}')) {
            if (cVar2 == '{') goto LAB_0015324e;
            goto LAB_0015320a;
          }
          iVar28 = iVar28 + -1;
          *(int *)(local_848._M_len + 0x24) = iVar28;
        } while ((int)(uint)local_848._M_str < iVar28);
      }
      else {
        *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str;
      }
      simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
      puVar19 = *(uint **)(local_848._M_len + 8);
      *(uint **)(local_848._M_len + 8) = puVar19 + 1;
      cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar19);
      bVar22 = true;
      plVar17 = (long *)local_848._M_len;
      if (cVar2 != ',') {
        if (cVar2 != '}') {
          *(long *)(local_848._M_len + 0x20) = 3;
          *(long *)(local_848._M_len + 0x10) = 0;
LAB_00154d2e:
          local_768.market_start_time_.field_2._8_4_ = 3;
          goto LAB_00154d3e;
        }
        if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
        if (*(int *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
        *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
        bVar22 = false;
      }
    }
    if (!bVar35) {
      *(uint *)((long)plVar17 + 0x24) = (uint)local_848._M_str;
      plVar17[1] = (long)(local_838[0]._M_allocated_capacity + 4);
      simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                ((value_iterator *)&local_848);
      ((*(parser **)(local_848._M_len + 0x10))->start_positions)._M_t.
      super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>._M_t
      .super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
      super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)(uint)local_848._M_str]
           = (uint *)local_838[0]._0_8_;
      bVar35 = *(char *)(*(long *)local_848._M_len +
                        (ulong)**(token_position *)(local_848._M_len + 8)) != '}';
      if (!bVar35) {
        *(token_position *)(local_848._M_len + 8) = *(token_position *)(local_848._M_len + 8) + 1;
        if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
        if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
        *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
      }
      while( true ) {
        if (!bVar35) goto LAB_0015576e;
        if (((json_iterator *)local_848._M_len)->_depth != (uint)local_848._M_str)
        goto LAB_0015574f;
        simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
        lVar24 = *(long *)local_848._M_len;
        puVar19 = *(token_position *)(local_848._M_len + 8);
        *(uint **)(local_848._M_len + 8) = puVar19 + 1;
        uVar26 = (ulong)*puVar19;
        pjVar21 = (json_iterator *)local_848._M_len;
        if (*(char *)(lVar24 + uVar26) != '\"') goto LAB_0015566f;
        simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
        lVar7 = *(long *)local_848._M_len;
        puVar19 = *(token_position *)(local_848._M_len + 8);
        *(uint **)(local_848._M_len + 8) = puVar19 + 1;
        pjVar21 = (json_iterator *)local_848._M_len;
        if (*(char *)(lVar7 + (ulong)*puVar19) != ':') goto LAB_001556c5;
        if (0x7ffffffd < (uint)local_848._M_str) goto LAB_0015581f;
        if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_00155800;
        lVar24 = lVar24 + uVar26;
        iVar28 = (uint)local_848._M_str + 1;
        *(int *)(local_848._M_len + 0x24) = iVar28;
        if ((*(char *)(lVar24 + 3) == '\"') && (*(short *)(lVar24 + 1) == 0x6469)) break;
        if (puVar19 + 1 <= (ulong)local_838[0]._0_8_) goto LAB_00155861;
        puVar29 = puVar19 + 2;
        *(uint **)(local_848._M_len + 8) = puVar29;
        uVar30 = *(byte *)(lVar7 + (ulong)puVar19[1]) - 0x2c;
        if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
           (*(byte *)(lVar7 + (ulong)puVar19[1]) == 0x7b)) {
          puVar19 = puVar29;
LAB_0015343a:
          do {
            while( true ) {
              _Var8._M_head_impl =
                   ((*(parser **)(local_848._M_len + 0x10))->implementation)._M_t.
                   super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                   _M_head_impl;
              if ((uint *)((ulong)(_Var8._M_head_impl)->n_structural_indexes * 4 +
                          (long)((_Var8._M_head_impl)->structural_indexes)._M_t) <= puVar19) {
                *(error_code *)(local_848._M_len + 0x20) = TAPE_ERROR;
                local_768.market_start_time_.field_2._8_4_ = 3;
                goto LAB_00154d3e;
              }
              puVar29 = puVar19 + 1;
              *(uint **)(local_848._M_len + 8) = puVar29;
              cVar2 = *(char *)(lVar7 + (ulong)*puVar19);
              puVar19 = puVar29;
              if (cVar2 != '[') break;
LAB_0015347e:
              iVar28 = iVar28 + 1;
              *(int *)(local_848._M_len + 0x24) = iVar28;
            }
            if ((cVar2 != ']') && (cVar2 != '}')) {
              if (cVar2 == '{') goto LAB_0015347e;
              goto LAB_0015343a;
            }
            iVar28 = iVar28 + -1;
            *(int *)(local_848._M_len + 0x24) = iVar28;
          } while ((int)(uint)local_848._M_str < iVar28);
        }
        else {
          *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str;
        }
        if (puVar29 == puVar18) {
          local_768.market_start_time_.field_2._8_4_ = 0x13;
          goto LAB_00154d3e;
        }
        simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
        puVar19 = *(token_position *)(local_848._M_len + 8);
        *(uint **)(local_848._M_len + 8) = puVar19 + 1;
        cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar19);
        bVar35 = true;
        if (cVar2 != ',') {
          pjVar21 = (json_iterator *)local_848._M_len;
          if (cVar2 != '}') goto LAB_0015569f;
          if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
          if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
          *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
          bVar35 = false;
        }
      }
LAB_00153505:
      simdjson::fallback::ondemand::value_iterator::assert_at_child((value_iterator *)&local_848);
      puVar19 = *(uint **)(local_848._M_len + 8);
      local_768.market_start_time_._M_string_length._0_4_ = (uint)local_848._M_str + 1;
      local_768.market_start_time_._M_dataplus._M_p = (pointer)local_848._M_len;
      local_768.market_start_time_.field_2._8_4_ = 0;
      puVar18 = *(uint **)(local_848._M_len + 8);
      _Var27._M_p = (pointer)local_848._M_len;
      local_768.market_start_time_.field_2._M_allocated_capacity = (size_type)puVar19;
      if (*(uint **)(local_848._M_len + 8) == puVar19) {
        simdjson::fallback::ondemand::value_iterator::assert_at_start((value_iterator *)&local_768);
        puVar19 = *(uint **)(local_768.market_start_time_._M_dataplus._M_p + 8);
        puVar18 = puVar19;
        _Var27._M_p = local_768.market_start_time_._M_dataplus._M_p;
      }
      lVar24 = *(long *)&((json_iterator *)_Var27._M_p)->token;
      uVar30 = *puVar19;
      if (*(char *)(lVar24 + (ulong)uVar30) == '\"') {
        if (puVar18 == (uint *)local_768.market_start_time_.field_2._M_allocated_capacity) {
          simdjson::fallback::ondemand::value_iterator::assert_at_start
                    ((value_iterator *)&local_768);
          *(token_position *)(local_768.market_start_time_._M_dataplus._M_p + 8) =
               *(token_position *)(local_768.market_start_time_._M_dataplus._M_p + 8) + 1;
          if (0x7ffffffd < (int)local_768.market_start_time_._M_string_length - 1U)
          goto LAB_00155894;
          if (*(int *)(local_768.market_start_time_._M_dataplus._M_p + 0x24) !=
              (int)local_768.market_start_time_._M_string_length) goto LAB_001558b3;
          *(uint *)(local_768.market_start_time_._M_dataplus._M_p + 0x24) =
               (int)local_768.market_start_time_._M_string_length - 1U;
          _Var27._M_p = local_768.market_start_time_._M_dataplus._M_p;
        }
        pbVar31 = ((json_iterator *)_Var27._M_p)->_string_buf_loc;
        pbVar33 = (byte *)(lVar24 + (ulong)uVar30 + 1);
        do {
          lVar24 = 1;
          bVar34 = *pbVar33;
          *pbVar31 = bVar34;
          if (bVar34 == 0x5c) {
            if ((ulong)pbVar33[1] == 0x75) {
              uVar15 = simdjson::fallback::anon_unknown_0::jsoncharutils::hex_to_u32_nocheck
                                 (pbVar33 + 2);
              pbVar32 = pbVar33 + 6;
              if ((uVar15 & 0xfffffc00) == 0xd800) {
                if (((*pbVar32 == 0x5c) && (pbVar33[7] == 0x75)) &&
                   (uVar16 = simdjson::fallback::anon_unknown_0::jsoncharutils::hex_to_u32_nocheck
                                       (pbVar33 + 8), uVar16 < 0x10000)) {
                  uVar15 = (uVar16 - 0xdc00 | uVar15 * 0x400 + 0xfca00000) + 0x10000;
                  pbVar32 = pbVar33 + 0xc;
                  goto LAB_00153665;
                }
LAB_00154f49:
                uVar25 = 5;
                goto LAB_0015512b;
              }
LAB_00153665:
              lVar24 = 1;
              bVar34 = (byte)uVar15;
              if (uVar15 < 0x80) {
                *pbVar31 = bVar34;
              }
              else if (uVar15 < 0x800) {
                *pbVar31 = (byte)(uVar15 >> 6) | 0xc0;
                pbVar31[1] = bVar34 & 0x3f | 0x80;
                lVar24 = 2;
              }
              else if (uVar15 < 0x10000) {
                *pbVar31 = (byte)(uVar15 >> 0xc) | 0xe0;
                pbVar31[1] = (byte)(uVar15 >> 6) & 0x3f | 0x80;
                pbVar31[2] = bVar34 & 0x3f | 0x80;
                lVar24 = 3;
              }
              else {
                if (0x10ffff < uVar15) goto LAB_00154f49;
                *pbVar31 = (byte)(uVar15 >> 0x12) | 0xf0;
                pbVar31[1] = (byte)(uVar15 >> 0xc) & 0x3f | 0x80;
                pbVar31[2] = (byte)(uVar15 >> 6) & 0x3f | 0x80;
                pbVar31[3] = bVar34 & 0x3f | 0x80;
                lVar24 = 4;
              }
            }
            else {
              if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map[pbVar33[1]]
                  == 0) {
                uVar25 = 5;
                goto LAB_0015512b;
              }
              *pbVar31 = simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                         [pbVar33[1]];
              pbVar32 = pbVar33 + 2;
            }
          }
          else {
            if (bVar34 == 0x22) goto LAB_00153753;
            pbVar32 = pbVar33 + 1;
          }
          pbVar31 = pbVar31 + lVar24;
          pbVar33 = pbVar32;
        } while( true );
      }
      uVar25 = 0x10;
LAB_0015512b:
      puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
      goto LAB_00154d66;
    }
    local_768.market_start_time_.field_2._8_4_ = 0x13;
  }
  goto LAB_00154d3e;
LAB_001556c5:
  pjVar21->error = TAPE_ERROR;
  goto LAB_001556cc;
LAB_00153753:
  local_7a8._8_8_ = ((json_iterator *)_Var27._M_p)->_string_buf_loc;
  ((json_iterator *)_Var27._M_p)->_string_buf_loc = pbVar31;
  local_7a8._0_8_ = (long)pbVar31 - local_7a8._8_8_;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&event_type,(basic_string_view<char,_std::char_traits<char>_> *)local_7a8,
             (allocator<char> *)&local_848);
  local_850 = ((token_iterator *)local_8a8._0_8_)->_position;
  bVar12 = local_848;
  if (local_850 <= local_898) goto LAB_001558dc;
  local_86c = (undefined4)CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),1);
  if (local_850 == local_898 + 1) {
LAB_00153841:
    bVar35 = true;
  }
  else {
    iVar28 = *(depth_t *)(local_8a8._0_8_ + 0x24);
    if (iVar28 < (int)local_8a8._8_4_) {
      if (iVar28 < local_8a8._8_4_ + -1) {
        local_768.market_start_time_.field_2._8_4_ = 0x19;
        goto LAB_00154af2;
      }
      *(undefined4 *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_;
      ((token_iterator *)local_8a8._0_8_)->_position = local_898 + 1;
      simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                ((value_iterator *)local_8a8);
      ((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
      super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>._M_t
      .super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
      super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_8a8._8_4_] =
           local_898;
      puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
      if (((token_iterator *)local_8a8._0_8_)->buf[*puVar19] == '}') {
        ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
        uVar30 = local_8a8._8_4_ - 1;
        if (0x7ffffffd < uVar30) goto LAB_00155894;
        if (*(depth_t *)(local_8a8._0_8_ + 0x24) == local_8a8._8_4_) goto LAB_00153b3e;
        goto LAB_001558b3;
      }
      goto LAB_00153841;
    }
    if ((int)local_8a8._8_4_ < iVar28) {
      puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
      puVar19 = local_850 + 1;
      ((token_iterator *)local_8a8._0_8_)->_position = puVar19;
      uVar1 = puVar3[*local_850];
      if (((uVar1 != ',') && (uVar1 != ':')) &&
         ((uVar1 != '[' && ((uVar1 == '}' || (uVar1 != '{')))))) {
        iVar28 = iVar28 + -1;
        *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
        local_850 = puVar19;
        if (iVar28 <= (int)local_8a8._8_4_) goto LAB_001538ef;
      }
      ppVar5 = *(parser **)(local_8a8._0_8_ + 0x10);
LAB_00153894:
      do {
        while( true ) {
          pdVar6 = (ppVar5->implementation)._M_t.
                   super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                   _M_head_impl;
          if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                      (long)(pdVar6->structural_indexes)._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                      ) <= puVar19) {
            *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
            *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
            local_768.market_start_time_.field_2._8_4_ = 3;
            goto LAB_00154af2;
          }
          local_850 = puVar19 + 1;
          ((token_iterator *)local_8a8._0_8_)->_position = local_850;
          uVar1 = puVar3[*puVar19];
          puVar19 = local_850;
          if (uVar1 != '[') break;
LAB_001538d8:
          iVar28 = iVar28 + 1;
          *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
        }
        if ((uVar1 != ']') && (uVar1 != '}')) {
          if (uVar1 == '{') goto LAB_001538d8;
          goto LAB_00153894;
        }
        iVar28 = iVar28 + -1;
        *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
      } while ((int)local_8a8._8_4_ < iVar28);
    }
LAB_001538ef:
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
    bVar35 = true;
    if (uVar1 != ',') {
      if (uVar1 != '}') {
LAB_00155051:
        *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
        *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
        local_768.market_start_time_.field_2._8_4_ = 3;
        goto LAB_00154af2;
      }
      if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
      *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
      bVar35 = false;
    }
    if (((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
        super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
        super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_8a8._8_4_] !=
        local_898) {
      local_768.market_start_time_.field_2._8_4_ = 0x19;
      goto LAB_00154af2;
    }
    local_86c = 0;
  }
  while (bVar35) {
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_0015583e;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar26 = (ulong)*puVar19;
    if (puVar3[uVar26] != '\"') goto LAB_00155051;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    pjVar21 = (json_iterator *)local_8a8._0_8_;
    puVar4 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    if (puVar4[*puVar19] != ':') {
      *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
      *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
      local_768.market_start_time_.field_2._8_4_ = 3;
      goto LAB_00154af2;
    }
    uVar25 = local_8a8._8_4_;
    if (0x7ffffffd < (uint)local_8a8._8_4_) goto LAB_0015581f;
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_00155800;
    iVar28 = local_8a8._8_4_ + 1;
    *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
    if ((puVar3[uVar26 + 6] == '\"') && (iVar14 = bcmp(puVar3 + uVar26 + 1,"event",5), iVar14 == 0))
    goto LAB_00153d9d;
    if (puVar19 + 1 <= local_898) goto LAB_00155861;
    (pjVar21->token)._position = puVar19 + 2;
    uVar30 = puVar4[puVar19[1]] - 0x2c;
    if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
       (puVar4[puVar19[1]] == 0x7b)) {
      ppVar5 = *(parser **)((long)pjVar21 + 0x10);
      puVar19 = puVar19 + 2;
LAB_00153a7d:
      do {
        while( true ) {
          pdVar6 = (ppVar5->implementation)._M_t.
                   super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                   _M_head_impl;
          if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                      (long)(pdVar6->structural_indexes)._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                      ) <= puVar19) goto LAB_00154adf;
          puVar18 = puVar19 + 1;
          (pjVar21->token)._position = puVar18;
          uVar1 = puVar4[*puVar19];
          puVar19 = puVar18;
          if (uVar1 != '[') break;
LAB_00153abb:
          iVar28 = iVar28 + 1;
          *(int *)((long)pjVar21 + 0x24) = iVar28;
        }
        if ((uVar1 != ']') && (uVar1 != '}')) {
          if (uVar1 == '{') goto LAB_00153abb;
          goto LAB_00153a7d;
        }
        iVar28 = iVar28 + -1;
        *(int *)((long)pjVar21 + 0x24) = iVar28;
      } while ((int)uVar25 < iVar28);
    }
    else {
      *(undefined4 *)((long)pjVar21 + 0x24) = uVar25;
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
    bVar35 = true;
    if (uVar1 != ',') {
      if (uVar1 != '}') {
        *(undefined8 *)(local_8a8._0_8_ + 0x20) = 3;
        *(parser **)(local_8a8._0_8_ + 0x10) = (parser *)0x0;
        local_768.market_start_time_.field_2._8_4_ = 3;
        goto LAB_00154af2;
      }
      uVar30 = local_8a8._8_4_ - 1;
      if (0x7ffffffd < uVar30) goto LAB_00155894;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
LAB_00153b3e:
      *(uint *)(local_8a8._0_8_ + 0x24) = uVar30;
      bVar35 = false;
    }
  }
  if ((char)local_86c != '\0') {
    local_768.market_start_time_.field_2._8_4_ = 0x13;
    goto LAB_00154af2;
  }
  *(undefined4 *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_;
  ((token_iterator *)local_8a8._0_8_)->_position = local_898 + 1;
  simdjson::fallback::ondemand::value_iterator::assert_at_container_start
            ((value_iterator *)local_8a8);
  ((*(parser **)(local_8a8._0_8_ + 0x10))->start_positions)._M_t.
  super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
  super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_8a8._8_4_] = local_898
  ;
  puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
  bVar35 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19] != '}';
  if (!bVar35) {
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
    *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
  }
  while( true ) {
    if (!bVar35) goto LAB_0015576e;
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_0015574f;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar3 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar26 = (ulong)*puVar19;
    pjVar21 = (json_iterator *)local_8a8._0_8_;
    if (puVar3[uVar26] != '\"') goto LAB_0015566f;
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    pjVar21 = (json_iterator *)local_8a8._0_8_;
    puVar4 = ((token_iterator *)local_8a8._0_8_)->buf;
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    if (puVar4[*puVar19] != ':') goto LAB_00155695;
    uVar25 = local_8a8._8_4_;
    if (0x7ffffffd < (uint)local_8a8._8_4_) goto LAB_0015581f;
    if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_00155800;
    iVar28 = local_8a8._8_4_ + 1;
    *(int *)(local_8a8._0_8_ + 0x24) = iVar28;
    if ((puVar3[uVar26 + 6] == '\"') && (iVar14 = bcmp(puVar3 + uVar26 + 1,"event",5), iVar14 == 0))
    break;
    if (puVar19 + 1 <= local_898) goto LAB_00155861;
    puVar18 = puVar19 + 2;
    (pjVar21->token)._position = puVar18;
    uVar30 = puVar4[puVar19[1]] - 0x2c;
    if (((uVar30 < 0x30) && ((0x800000004001U >> ((ulong)uVar30 & 0x3f) & 1) != 0)) ||
       (puVar4[puVar19[1]] == 0x7b)) {
      ppVar5 = *(parser **)((long)pjVar21 + 0x10);
      puVar19 = puVar18;
LAB_00153ccc:
      do {
        while( true ) {
          pdVar6 = (ppVar5->implementation)._M_t.
                   super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                   .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                   _M_head_impl;
          if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                      (long)(pdVar6->structural_indexes)._M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                      ) <= puVar19) goto LAB_00154adf;
          puVar18 = puVar19 + 1;
          (pjVar21->token)._position = puVar18;
          uVar1 = puVar4[*puVar19];
          puVar19 = puVar18;
          if (uVar1 != '[') break;
LAB_00153d0a:
          iVar28 = iVar28 + 1;
          *(int *)((long)pjVar21 + 0x24) = iVar28;
        }
        if ((uVar1 != ']') && (uVar1 != '}')) {
          if (uVar1 == '{') goto LAB_00153d0a;
          goto LAB_00153ccc;
        }
        iVar28 = iVar28 + -1;
        *(int *)((long)pjVar21 + 0x24) = iVar28;
      } while ((int)uVar25 < iVar28);
    }
    else {
      *(undefined4 *)((long)pjVar21 + 0x24) = uVar25;
    }
    if (puVar18 == local_850) {
      local_768.market_start_time_.field_2._8_4_ = 0x13;
      goto LAB_00154af2;
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)local_8a8);
    puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
    ((token_iterator *)local_8a8._0_8_)->_position = puVar19 + 1;
    uVar1 = ((token_iterator *)local_8a8._0_8_)->buf[*puVar19];
    bVar35 = true;
    if (uVar1 != ',') {
      pjVar21 = (json_iterator *)local_8a8._0_8_;
      if (uVar1 != '}') goto LAB_0015569f;
      if (0x7ffffffd < local_8a8._8_4_ - 1) goto LAB_00155894;
      if (*(depth_t *)(local_8a8._0_8_ + 0x24) != local_8a8._8_4_) goto LAB_001558b3;
      *(uint *)(local_8a8._0_8_ + 0x24) = local_8a8._8_4_ - 1;
      bVar35 = false;
    }
  }
LAB_00153d9d:
  simdjson::fallback::ondemand::value_iterator::assert_at_child((value_iterator *)local_8a8);
  puVar19 = ((token_iterator *)local_8a8._0_8_)->_position;
  local_7a8._8_4_ = local_8a8._8_4_ + 1;
  local_7a8._0_8_ = local_8a8._0_8_;
  local_790 = 0;
  local_798 = puVar19;
  if (((token_iterator *)local_8a8._0_8_)->_position == puVar19) {
    simdjson::fallback::ondemand::value_iterator::assert_at_start((value_iterator *)local_7a8);
    puVar19 = ((token_iterator *)local_7a8._0_8_)->_position;
    if (((token_iterator *)local_7a8._0_8_)->buf[*puVar19] != '{') {
      local_768.market_start_time_.field_2._8_4_ = 0x10;
      goto LAB_00154b20;
    }
    ((token_iterator *)local_7a8._0_8_)->_position = puVar19 + 1;
    simdjson::fallback::ondemand::value_iterator::assert_at_container_start
              ((value_iterator *)local_7a8);
    ((*(parser **)(local_7a8._0_8_ + 0x10))->start_positions)._M_t.
    super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>._M_t.
    super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
    super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)local_7a8._8_4_] =
         local_798;
    puVar19 = ((token_iterator *)local_7a8._0_8_)->_position;
    if (((token_iterator *)local_7a8._0_8_)->buf[*puVar19] == '}') {
      ((token_iterator *)local_7a8._0_8_)->_position = puVar19 + 1;
      uVar30 = local_7a8._8_4_ - 1;
      puVar19 = (uint *)(ulong)uVar30;
      if (0x7ffffffd < uVar30) goto LAB_00155894;
      if (*(depth_t *)(local_7a8._0_8_ + 0x24) != local_7a8._8_4_) goto LAB_001558b3;
      *(uint *)(local_7a8._0_8_ + 0x24) = uVar30;
    }
  }
  local_848._M_len = local_7a8._0_8_;
  local_848._M_str = (char *)local_7a8._8_8_;
  bVar12 = local_848;
  local_838[0]._M_allocated_capacity = local_798;
  local_838[0]._8_4_ = 0;
  local_848._M_len = local_7a8._0_8_;
  local_850 = *(uint **)(local_848._M_len + 8);
  if (local_850 <= local_798) {
LAB_001558dc:
    local_848 = bVar12;
    __assert_fail("_json_iter->token._position > _start_position",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x66d5,
                  "bool simdjson::fallback::ondemand::value_iterator::at_first_field() const");
  }
  local_86c = (undefined4)CONCAT71((int7)((ulong)puVar19 >> 8),1);
  plVar17 = (long *)local_848._M_len;
  if (local_850 == local_798 + 1) {
LAB_00153f75:
    local_848 = bVar12;
    bVar35 = true;
  }
  else {
    iVar28 = *(int *)(local_848._M_len + 0x24);
    local_848._M_str._0_4_ = local_7a8._8_4_;
    local_848 = bVar12;
    if (iVar28 < (int)(uint)local_848._M_str) {
      if (iVar28 < (int)((uint)local_848._M_str + -1)) {
        local_768.market_start_time_.field_2._8_4_ = 0x19;
        goto LAB_00154b20;
      }
      *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str;
      *(uint **)(local_848._M_len + 8) = local_798 + 1;
      simdjson::fallback::ondemand::value_iterator::assert_at_container_start
                ((value_iterator *)&local_848);
      *(undefined8 *)
       (*(long *)(*(long *)(local_848._M_len + 0x10) + 0x30) + (long)(int)(uint)local_848._M_str * 8
       ) = local_838[0]._M_allocated_capacity;
      plVar17 = (long *)local_848._M_len;
      bVar12 = local_848;
      if (*(char *)(*(long *)local_848._M_len + (ulong)**(uint **)(local_848._M_len + 8)) != '}')
      goto LAB_00153f75;
      *(uint **)(local_848._M_len + 8) = *(uint **)(local_848._M_len + 8) + 1;
      if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
      if (*(int *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
      *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
      bVar35 = false;
    }
    else {
      if ((int)(uint)local_848._M_str < iVar28) {
        puVar19 = local_850 + 1;
        *(uint **)(local_848._M_len + 8) = puVar19;
        cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*local_850);
        if ((((cVar2 != ',') && (cVar2 != ':')) && (cVar2 != '[')) &&
           ((cVar2 == '}' || (cVar2 != '{')))) {
          iVar28 = iVar28 + -1;
          *(int *)(local_848._M_len + 0x24) = iVar28;
          local_850 = puVar19;
          if (iVar28 <= (int)(uint)local_848._M_str) goto LAB_00154023;
        }
LAB_00153fc8:
        do {
          while( true ) {
            if ((uint *)((ulong)*(uint *)(*(long *)(*(long *)(local_848._M_len + 0x10) + 8) + 8) * 4
                        + *(long *)(*(long *)(*(long *)(local_848._M_len + 0x10) + 8) + 0x10)) <=
                puVar19) {
              *(long *)(local_848._M_len + 0x20) = 3;
              *(long *)(local_848._M_len + 0x10) = 0;
              local_768.market_start_time_.field_2._8_4_ = 3;
              goto LAB_00154b20;
            }
            local_850 = puVar19 + 1;
            *(uint **)(local_848._M_len + 8) = local_850;
            cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar19);
            puVar19 = local_850;
            if (cVar2 != '[') break;
LAB_0015400c:
            iVar28 = iVar28 + 1;
            *(int *)(local_848._M_len + 0x24) = iVar28;
          }
          if ((cVar2 != ']') && (cVar2 != '}')) {
            if (cVar2 == '{') goto LAB_0015400c;
            goto LAB_00153fc8;
          }
          iVar28 = iVar28 + -1;
          *(int *)(local_848._M_len + 0x24) = iVar28;
        } while ((int)(uint)local_848._M_str < iVar28);
      }
LAB_00154023:
      simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
      puVar19 = *(uint **)(local_848._M_len + 8);
      *(uint **)(local_848._M_len + 8) = puVar19 + 1;
      cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar19);
      bVar35 = true;
      if (cVar2 != ',') {
        if (cVar2 != '}') {
          *(long *)(local_848._M_len + 0x20) = 3;
          *(long *)(local_848._M_len + 0x10) = 0;
          local_768.market_start_time_.field_2._8_4_ = 3;
          goto LAB_00154b20;
        }
        if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
        if (*(int *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
        *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
        bVar35 = false;
      }
      if (*(uint **)(*(long *)(*(long *)(local_848._M_len + 0x10) + 0x30) +
                    (long)(int)(uint)local_848._M_str * 8) != (uint *)local_838[0]._0_8_) {
        local_768.market_start_time_.field_2._8_4_ = 0x19;
        goto LAB_00154b20;
      }
      local_86c = 0;
      plVar17 = (long *)local_848._M_len;
    }
  }
  while (bVar35) {
    if (*(int *)((long)plVar17 + 0x24) != (uint)local_848._M_str) {
LAB_0015583e:
      __assert_fail("_json_iter->_depth == _depth",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x6534,
                    "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                   );
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
    lVar24 = *(long *)local_848._M_len;
    puVar19 = *(uint **)(local_848._M_len + 8);
    *(uint **)(local_848._M_len + 8) = puVar19 + 1;
    uVar26 = (ulong)*puVar19;
    if (*(char *)(lVar24 + uVar26) != '\"') {
      *(long *)(local_848._M_len + 0x20) = 3;
      *(long *)(local_848._M_len + 0x10) = 0;
      local_768.market_start_time_.field_2._8_4_ = 3;
      goto LAB_00154b20;
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
    pjVar21 = (json_iterator *)local_848._M_len;
    lVar7 = *(long *)local_848._M_len;
    puVar19 = *(token_position *)(local_848._M_len + 8);
    *(uint **)(local_848._M_len + 8) = puVar19 + 1;
    if (*(char *)(lVar7 + (ulong)*puVar19) != ':') {
      *(long *)(local_848._M_len + 0x20) = 3;
      *(parser **)(local_848._M_len + 0x10) = (parser *)0x0;
      local_768.market_start_time_.field_2._8_4_ = 3;
      goto LAB_00154b20;
    }
    uVar30 = (uint)local_848._M_str;
    if (0x7ffffffd < (uint)local_848._M_str) goto LAB_0015581f;
    if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_00155800;
    lVar24 = lVar24 + uVar26;
    iVar28 = (uint)local_848._M_str + 1;
    *(int *)(local_848._M_len + 0x24) = iVar28;
    if ((*(char *)(lVar24 + 0xc) == '\"') &&
       (iVar14 = bcmp((void *)(lVar24 + 1),"countryCode",0xb), iVar14 == 0)) goto LAB_001544ea;
    if (puVar19 + 1 <= (ulong)local_838[0]._0_8_) goto LAB_00155861;
    *(uint **)((long)pjVar21 + 8) = puVar19 + 2;
    uVar23 = *(byte *)(lVar7 + (ulong)puVar19[1]) - 0x2c;
    if (((uVar23 < 0x30) && ((0x800000004001U >> ((ulong)uVar23 & 0x3f) & 1) != 0)) ||
       (*(byte *)(lVar7 + (ulong)puVar19[1]) == 0x7b)) {
      puVar19 = puVar19 + 2;
LAB_001541bb:
      do {
        while( true ) {
          _Var8._M_head_impl =
               ((*(parser **)((long)pjVar21 + 0x10))->implementation)._M_t.
               super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
               .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
               _M_head_impl;
          if ((uint *)((ulong)(_Var8._M_head_impl)->n_structural_indexes * 4 +
                      (long)((_Var8._M_head_impl)->structural_indexes)._M_t) <= puVar19)
          goto LAB_00154b0d;
          puVar18 = puVar19 + 1;
          *(uint **)((long)pjVar21 + 8) = puVar18;
          cVar2 = *(char *)(lVar7 + (ulong)*puVar19);
          puVar19 = puVar18;
          if (cVar2 != '[') break;
LAB_001541f9:
          iVar28 = iVar28 + 1;
          *(int *)((long)pjVar21 + 0x24) = iVar28;
        }
        if ((cVar2 != ']') && (cVar2 != '}')) {
          if (cVar2 == '{') goto LAB_001541f9;
          goto LAB_001541bb;
        }
        iVar28 = iVar28 + -1;
        *(int *)((long)pjVar21 + 0x24) = iVar28;
      } while ((int)uVar30 < iVar28);
    }
    else {
      *(uint *)((long)pjVar21 + 0x24) = uVar30;
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
    puVar19 = *(uint **)(local_848._M_len + 8);
    *(uint **)(local_848._M_len + 8) = puVar19 + 1;
    cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar19);
    bVar35 = true;
    plVar17 = (long *)local_848._M_len;
    if (cVar2 != ',') {
      if (cVar2 != '}') {
        *(long *)(local_848._M_len + 0x20) = 3;
        *(long *)(local_848._M_len + 0x10) = 0;
        local_768.market_start_time_.field_2._8_4_ = 3;
        goto LAB_00154b20;
      }
      if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
      if (*(int *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
      *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
      bVar35 = false;
    }
  }
  if ((char)local_86c == '\0') {
    *(uint *)((long)plVar17 + 0x24) = (uint)local_848._M_str;
    plVar17[1] = (long)(local_838[0]._M_allocated_capacity + 4);
    simdjson::fallback::ondemand::value_iterator::assert_at_container_start
              ((value_iterator *)&local_848);
    ((*(parser **)(local_848._M_len + 0x10))->start_positions)._M_t.
    super___uniq_ptr_impl<const_unsigned_int_*,_std::default_delete<const_unsigned_int_*[]>_>._M_t.
    super__Tuple_impl<0UL,_const_unsigned_int_**,_std::default_delete<const_unsigned_int_*[]>_>.
    super__Head_base<0UL,_const_unsigned_int_**,_false>._M_head_impl[(int)(uint)local_848._M_str] =
         (uint *)local_838[0]._0_8_;
    bVar35 = *(char *)(*(long *)local_848._M_len + (ulong)**(token_position *)(local_848._M_len + 8)
                      ) != '}';
    if (!bVar35) {
      *(token_position *)(local_848._M_len + 8) = *(token_position *)(local_848._M_len + 8) + 1;
      if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
      if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
      *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
    }
LAB_0015430a:
    if (!bVar35) {
LAB_0015576e:
      __assert_fail("has_value",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x6565,
                    "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                   );
    }
    if (((json_iterator *)local_848._M_len)->_depth != (uint)local_848._M_str) {
LAB_0015574f:
      __assert_fail("_json_iter->_depth == _depth",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x6566,
                    "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                   );
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
    lVar24 = *(long *)local_848._M_len;
    puVar19 = *(token_position *)(local_848._M_len + 8);
    *(uint **)(local_848._M_len + 8) = puVar19 + 1;
    uVar26 = (ulong)*puVar19;
    pjVar21 = (json_iterator *)local_848._M_len;
    if (*(char *)(lVar24 + uVar26) != '\"') {
LAB_0015566f:
      pjVar21->error = TAPE_ERROR;
      __assert_fail("!error",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x656e,
                    "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                   );
    }
    simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
    pjVar21 = (json_iterator *)local_848._M_len;
    lVar7 = *(long *)local_848._M_len;
    puVar19 = *(token_position *)(local_848._M_len + 8);
    *(uint **)(local_848._M_len + 8) = puVar19 + 1;
    if (*(char *)(lVar7 + (ulong)*puVar19) != ':') goto LAB_00155695;
    uVar30 = (uint)local_848._M_str;
    if (0x7ffffffd < (uint)local_848._M_str) goto LAB_0015581f;
    if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_00155800;
    lVar24 = lVar24 + uVar26;
    iVar28 = (uint)local_848._M_str + 1;
    *(int *)(local_848._M_len + 0x24) = iVar28;
    if ((*(char *)(lVar24 + 0xc) != '\"') ||
       (iVar14 = bcmp((void *)(lVar24 + 1),"countryCode",0xb), iVar14 != 0)) {
      if (puVar19 + 1 <= (ulong)local_838[0]._0_8_) goto LAB_00155861;
      puVar18 = puVar19 + 2;
      *(uint **)((long)pjVar21 + 8) = puVar18;
      uVar23 = *(byte *)(lVar7 + (ulong)puVar19[1]) - 0x2c;
      if (((uVar23 < 0x30) && ((0x800000004001U >> ((ulong)uVar23 & 0x3f) & 1) != 0)) ||
         (*(byte *)(lVar7 + (ulong)puVar19[1]) == 0x7b)) {
        puVar19 = puVar18;
LAB_00154416:
        do {
          while( true ) {
            _Var8._M_head_impl =
                 ((*(parser **)((long)pjVar21 + 0x10))->implementation)._M_t.
                 super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                 .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                 _M_head_impl;
            if ((uint *)((ulong)(_Var8._M_head_impl)->n_structural_indexes * 4 +
                        (long)((_Var8._M_head_impl)->structural_indexes)._M_t) <= puVar19)
            goto LAB_00154b0d;
            puVar18 = puVar19 + 1;
            *(uint **)((long)pjVar21 + 8) = puVar18;
            cVar2 = *(char *)(lVar7 + (ulong)*puVar19);
            puVar19 = puVar18;
            if (cVar2 != '[') break;
LAB_00154454:
            iVar28 = iVar28 + 1;
            *(int *)((long)pjVar21 + 0x24) = iVar28;
          }
          if ((cVar2 != ']') && (cVar2 != '}')) {
            if (cVar2 == '{') goto LAB_00154454;
            goto LAB_00154416;
          }
          iVar28 = iVar28 + -1;
          *(int *)((long)pjVar21 + 0x24) = iVar28;
        } while ((int)uVar30 < iVar28);
      }
      else {
        *(uint *)((long)pjVar21 + 0x24) = uVar30;
      }
      if (puVar18 == local_850) {
        local_768.market_start_time_.field_2._8_4_ = 0x13;
        goto LAB_00154b20;
      }
      simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_848);
      puVar19 = *(token_position *)(local_848._M_len + 8);
      *(uint **)(local_848._M_len + 8) = puVar19 + 1;
      cVar2 = *(char *)(*(long *)local_848._M_len + (ulong)*puVar19);
      bVar35 = true;
      if (cVar2 != ',') {
        pjVar21 = (json_iterator *)local_848._M_len;
        if (cVar2 != '}') {
LAB_0015569f:
          pjVar21->error = TAPE_ERROR;
          __assert_fail("!error",
                        "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                        ,0x658d,
                        "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                       );
        }
        if (0x7ffffffd < (uint)local_848._M_str - 1) goto LAB_00155894;
        if (*(depth_t *)(local_848._M_len + 0x24) != (uint)local_848._M_str) goto LAB_001558b3;
        *(uint *)(local_848._M_len + 0x24) = (uint)local_848._M_str - 1;
        bVar35 = false;
      }
      goto LAB_0015430a;
    }
LAB_001544ea:
    simdjson::fallback::ondemand::value_iterator::assert_at_child((value_iterator *)&local_848);
    puVar19 = *(uint **)(local_848._M_len + 8);
    local_768.market_start_time_._M_string_length._0_4_ = (uint)local_848._M_str + 1;
    local_768.market_start_time_._M_dataplus._M_p = (pointer)local_848._M_len;
    local_768.market_start_time_.field_2._8_4_ = 0;
    puVar18 = *(uint **)(local_848._M_len + 8);
    _Var27._M_p = (pointer)local_848._M_len;
    local_768.market_start_time_.field_2._M_allocated_capacity = (size_type)puVar19;
    if (*(uint **)(local_848._M_len + 8) == puVar19) {
      simdjson::fallback::ondemand::value_iterator::assert_at_start((value_iterator *)&local_768);
      puVar19 = *(uint **)(local_768.market_start_time_._M_dataplus._M_p + 8);
      puVar18 = puVar19;
      _Var27._M_p = local_768.market_start_time_._M_dataplus._M_p;
    }
    lVar24 = *(long *)&((json_iterator *)_Var27._M_p)->token;
    uVar30 = *puVar19;
    if (*(char *)(lVar24 + (ulong)uVar30) == '\"') {
      if (puVar18 == (uint *)local_768.market_start_time_.field_2._M_allocated_capacity) {
        simdjson::fallback::ondemand::value_iterator::assert_at_start((value_iterator *)&local_768);
        *(token_position *)(local_768.market_start_time_._M_dataplus._M_p + 8) =
             *(token_position *)(local_768.market_start_time_._M_dataplus._M_p + 8) + 1;
        if (0x7ffffffd < (int)local_768.market_start_time_._M_string_length - 1U) goto LAB_00155894;
        if (*(int *)(local_768.market_start_time_._M_dataplus._M_p + 0x24) !=
            (int)local_768.market_start_time_._M_string_length) goto LAB_001558b3;
        *(uint *)(local_768.market_start_time_._M_dataplus._M_p + 0x24) =
             (int)local_768.market_start_time_._M_string_length - 1U;
        _Var27._M_p = local_768.market_start_time_._M_dataplus._M_p;
      }
      pbVar31 = ((json_iterator *)_Var27._M_p)->_string_buf_loc;
      pbVar33 = (byte *)(lVar24 + (ulong)uVar30 + 1);
      do {
        lVar24 = 1;
        bVar34 = *pbVar33;
        *pbVar31 = bVar34;
        if (bVar34 == 0x5c) {
          if ((ulong)pbVar33[1] == 0x75) {
            uVar15 = simdjson::fallback::anon_unknown_0::jsoncharutils::hex_to_u32_nocheck
                               (pbVar33 + 2);
            pbVar32 = pbVar33 + 6;
            if ((uVar15 & 0xfffffc00) == 0xd800) {
              if (((*pbVar32 == 0x5c) && (pbVar33[7] == 0x75)) &&
                 (uVar16 = simdjson::fallback::anon_unknown_0::jsoncharutils::hex_to_u32_nocheck
                                     (pbVar33 + 8), uVar16 < 0x10000)) {
                uVar15 = (uVar16 - 0xdc00 | uVar15 * 0x400 + 0xfca00000) + 0x10000;
                pbVar32 = pbVar33 + 0xc;
                goto LAB_00154643;
              }
LAB_00154f5b:
              uVar25 = 5;
              goto LAB_0015514b;
            }
LAB_00154643:
            lVar24 = 1;
            bVar34 = (byte)uVar15;
            if (uVar15 < 0x80) {
              *pbVar31 = bVar34;
            }
            else if (uVar15 < 0x800) {
              *pbVar31 = (byte)(uVar15 >> 6) | 0xc0;
              pbVar31[1] = bVar34 & 0x3f | 0x80;
              lVar24 = 2;
            }
            else if (uVar15 < 0x10000) {
              *pbVar31 = (byte)(uVar15 >> 0xc) | 0xe0;
              pbVar31[1] = (byte)(uVar15 >> 6) & 0x3f | 0x80;
              pbVar31[2] = bVar34 & 0x3f | 0x80;
              lVar24 = 3;
            }
            else {
              if (0x10ffff < uVar15) goto LAB_00154f5b;
              *pbVar31 = (byte)(uVar15 >> 0x12) | 0xf0;
              pbVar31[1] = (byte)(uVar15 >> 0xc) & 0x3f | 0x80;
              pbVar31[2] = (byte)(uVar15 >> 6) & 0x3f | 0x80;
              pbVar31[3] = bVar34 & 0x3f | 0x80;
              lVar24 = 4;
            }
          }
          else {
            if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map[pbVar33[1]] ==
                0) {
              uVar25 = 5;
              goto LAB_0015514b;
            }
            *pbVar31 = simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                       [pbVar33[1]];
            pbVar32 = pbVar33 + 2;
          }
        }
        else {
          if (bVar34 == 0x22) goto LAB_00154729;
          pbVar32 = pbVar33 + 1;
        }
        pbVar31 = pbVar31 + lVar24;
        pbVar33 = pbVar32;
      } while( true );
    }
    uVar25 = 0x10;
LAB_0015514b:
    puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
    goto LAB_00154b4b;
  }
  local_768.market_start_time_.field_2._8_4_ = 0x13;
  goto LAB_00154b20;
LAB_00154729:
  local_528._M_str = (char *)((json_iterator *)_Var27._M_p)->_string_buf_loc;
  ((json_iterator *)_Var27._M_p)->_string_buf_loc = pbVar31;
  local_528._M_len = (long)pbVar31 - (long)local_528._M_str;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&country_code,&local_528,(allocator<char> *)&local_848);
  std::__cxx11::string::string((string *)&local_4b8,(string *)&m_tm);
  std::__cxx11::string::string((string *)&local_4d8,(string *)&event_type);
  std::__cxx11::string::string((string *)&local_338,(string *)&country_code);
  Market_Projection::Market_Projection(&local_768,&local_4b8,&local_4d8,&local_338);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_hedg::Market_Projection,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
              *)&local_848,&m_id,&local_768);
  std::
  deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>
  ::emplace_back<std::pair<std::__cxx11::string,hedg::Market_Projection>>
            ((deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>
              *)&this->markets_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
              *)&local_848);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
           *)&local_848);
  Market_Projection::~Market_Projection(&local_768);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&country_code);
  std::__cxx11::string::~string((string *)&event_type);
  std::__cxx11::string::~string((string *)&m_tm);
  std::__cxx11::string::~string((string *)&m_id);
  if (local_7b0 != SUCCESS) {
    local_7b0 = SUCCESS;
    goto LAB_0015163f;
  }
  if (*(error_code *)(local_7c8._M_len + 0x20) != SUCCESS) goto LAB_0015163f;
  puVar19 = ((token_iterator *)local_7c8._M_len)->_position;
  if (puVar19 <= local_7b8) {
LAB_00155861:
    __assert_fail("_json_iter->token._position > _start_position",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x66b7,"error_code simdjson::fallback::ondemand::value_iterator::skip_child()");
  }
  iVar28 = *(depth_t *)(local_7c8._M_len + 0x24);
  if (iVar28 < (int)(uint)local_7c8._M_str) {
    __assert_fail("_json_iter->_depth >= _depth",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x66b8,"error_code simdjson::fallback::ondemand::value_iterator::skip_child()");
  }
  if ((int)(uint)local_7c8._M_str < iVar28) {
    puVar3 = ((token_iterator *)local_7c8._M_len)->buf;
    ((token_iterator *)local_7c8._M_len)->_position = puVar19 + 1;
    uVar1 = puVar3[*puVar19];
    if (((uVar1 != ',') && (uVar1 != ':')) && ((uVar1 != '[' && ((uVar1 == '}' || (uVar1 != '{')))))
       ) {
      iVar28 = iVar28 + -1;
      *(int *)(local_7c8._M_len + 0x24) = iVar28;
      if (iVar28 <= (int)(uint)local_7c8._M_str) goto LAB_0015495f;
    }
    ppVar5 = *(parser **)(local_7c8._M_len + 0x10);
    puVar19 = puVar19 + 1;
LAB_0015490b:
    do {
      while( true ) {
        pdVar6 = (ppVar5->implementation)._M_t.
                 super___uniq_ptr_impl<simdjson::internal::dom_parser_implementation,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_simdjson::internal::dom_parser_implementation_*,_std::default_delete<simdjson::internal::dom_parser_implementation>_>
                 .super__Head_base<0UL,_simdjson::internal::dom_parser_implementation_*,_false>.
                 _M_head_impl;
        if ((uint *)((ulong)pdVar6->n_structural_indexes * 4 +
                    (long)(pdVar6->structural_indexes)._M_t.
                          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>)
            <= puVar19) goto LAB_001549b7;
        puVar18 = puVar19 + 1;
        ((token_iterator *)local_7c8._M_len)->_position = puVar18;
        uVar1 = puVar3[*puVar19];
        puVar19 = puVar18;
        if (uVar1 != '[') break;
LAB_0015494f:
        iVar28 = iVar28 + 1;
        *(int *)(local_7c8._M_len + 0x24) = iVar28;
      }
      if ((uVar1 != ']') && (uVar1 != '}')) {
        if (uVar1 == '{') goto LAB_0015494f;
        goto LAB_0015490b;
      }
      iVar28 = iVar28 + -1;
      *(int *)(local_7c8._M_len + 0x24) = iVar28;
    } while ((int)(uint)local_7c8._M_str < iVar28);
  }
LAB_0015495f:
  simdjson::fallback::ondemand::value_iterator::assert_at_next((value_iterator *)&local_7c8);
  puVar19 = ((token_iterator *)local_7c8._M_len)->_position;
  ((token_iterator *)local_7c8._M_len)->_position = puVar19 + 1;
  uVar1 = ((token_iterator *)local_7c8._M_len)->buf[*puVar19];
  if (uVar1 == ',') {
    if (0x7ffffffd < (uint)local_7c8._M_str) goto LAB_0015581f;
    if (*(depth_t *)(local_7c8._M_len + 0x24) != (uint)local_7c8._M_str) goto LAB_00155800;
    uVar30 = (uint)local_7c8._M_str + 1;
  }
  else {
    if (uVar1 != ']') {
LAB_001549b7:
      ((json_iterator *)local_7c8._M_len)->error = TAPE_ERROR;
      goto LAB_0015163f;
    }
    uVar30 = (uint)local_7c8._M_str - 1;
    if (0x7ffffffd < uVar30) goto LAB_00155894;
    if (*(depth_t *)(local_7c8._M_len + 0x24) != (uint)local_7c8._M_str) goto LAB_001558b3;
  }
  *(uint *)(local_7c8._M_len + 0x24) = uVar30;
  goto LAB_0015163f;
LAB_00154b0d:
  pjVar21->error = TAPE_ERROR;
  local_768.market_start_time_.field_2._8_4_ = 3;
  goto LAB_00154b20;
LAB_00155695:
  pjVar21->error = TAPE_ERROR;
LAB_001556cc:
  __assert_fail("!error",
                "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                ,0x6571,
                "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
               );
LAB_00154aae:
  pjVar21->error = TAPE_ERROR;
  local_768.market_start_time_.field_2._8_4_ = 3;
LAB_00154ac1:
  country_code.field_2._M_allocated_capacity = 0;
  country_code._M_dataplus._M_p = (pointer)0x0;
  country_code._M_string_length = 0;
  country_code.field_2._8_4_ = local_768.market_start_time_.field_2._8_4_;
LAB_00154d3e:
  local_768.market_start_time_._M_dataplus._M_p = (pointer)0x0;
  local_768.market_start_time_._M_string_length = 0;
  local_768.market_start_time_.field_2._M_allocated_capacity = 0;
  puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
  uVar25 = local_768.market_start_time_.field_2._8_4_;
LAB_00154d66:
  *puVar20 = &PTR__exception_001efe80;
  *(undefined4 *)(puVar20 + 1) = uVar25;
  __cxa_throw(puVar20,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
LAB_00154a57:
  pjVar21->error = TAPE_ERROR;
  local_838[0]._8_4_ = 3;
LAB_00154a6a:
  local_848._M_len = 0;
  local_848._M_str = (char *)0x0;
  local_838[0]._M_allocated_capacity = (uint *)0x0;
  puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
  uVar25 = local_838[0]._8_4_;
LAB_00154a86:
  *puVar20 = &PTR__exception_001efe80;
  *(undefined4 *)(puVar20 + 1) = uVar25;
  __cxa_throw(puVar20,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
LAB_00154adf:
  pjVar21->error = TAPE_ERROR;
  local_768.market_start_time_.field_2._8_4_ = 3;
LAB_00154af2:
  local_798 = (uint *)0x0;
  local_7a8._0_8_ = 0;
  local_7a8._8_8_ = (char *)0x0;
  local_790 = local_768.market_start_time_.field_2._8_4_;
LAB_00154b20:
  local_768.market_start_time_._M_dataplus._M_p = (pointer)0x0;
  local_768.market_start_time_._M_string_length = 0;
  local_768.market_start_time_.field_2._M_allocated_capacity = 0;
  puVar20 = (undefined8 *)__cxa_allocate_exception(0x10);
  uVar25 = local_768.market_start_time_.field_2._8_4_;
LAB_00154b4b:
  *puVar20 = &PTR__exception_001efe80;
  *(undefined4 *)(puVar20 + 1) = uVar25;
  __cxa_throw(puVar20,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
}

Assistant:

void MarketGenerator::generate() {
	
	for (;;) {

		{
			std::scoped_lock<std::mutex> lk(mut_);

			try {
				session_id_ = Betfair_Auth::get_session_id();

				std::string start_time = Timing::now();
				std::string end_time = Timing::after(time_span_, time_unit_);

				io_service service;
				ssl::context context{ ssl::context::tlsv12_client };

				Client<Rest_Client> rest_cl{ config::betting_host, config::betting_port, service, context };
				rest_cl.send_request(rest::message<params::market_catalogue>, params::market_catalogue(session_id_, start_time, end_time));
				simdjson::padded_string p_d{ std::move(rest_cl.recv_response()) };

				simdjson::ondemand::parser parser;

				for (simdjson::ondemand::object market : parser.iterate(p_d)) {
					std::string m_id = std::string(std::string_view(market["marketId"]));
					std::string m_tm = std::string(std::string_view(market["marketStartTime"]));
					std::string event_type = std::string(std::string_view(market["eventType"]["id"]));
					std::string country_code = std::string(std::string_view(market["event"]["countryCode"]));
					markets_.push({ m_id, Market_Projection{m_tm, event_type, country_code} });
				}
			} catch (boost::system::system_error e) {
				spdlog::error(e.what());
			} catch (...) {
				spdlog::error("invalid config info");
				throw std::exception();
			}
		}
		data_cond_.notify_all();
		std::this_thread::sleep_for(std::chrono::seconds(calc_time()));
	}
}